

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImVector<ImGuiKeyRoutingData> *pIVar1;
  ImGuiWindow **ppIVar2;
  ImVec2 *pIVar3;
  float *pfVar4;
  int *piVar5;
  ImS8 *pIVar6;
  short *psVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  ImGuiNavLayer IVar11;
  ImGuiContextHook *pIVar12;
  uint *puVar13;
  ImGuiViewportP *pIVar14;
  ImGuiInputEvent *pIVar15;
  ImGuiKeyRoutingData *pIVar16;
  ImGuiKeyRoutingData *__src;
  ImGuiTableTempData *pIVar17;
  ImGuiWindowStackData *pIVar18;
  ImGuiPopupData *pIVar19;
  ImGuiGroupData *pIVar20;
  ImGuiStackLevelInfo *pIVar21;
  int iVar22;
  undefined1 auVar23 [12];
  ImGuiContext *pIVar24;
  ImU16 IVar25;
  undefined3 uVar26;
  ImGuiContext *pIVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  ImU8 IVar32;
  short sVar33;
  undefined2 uVar34;
  uint uVar35;
  ImGuiID IVar36;
  ImGuiInputSource IVar37;
  ImGuiInputSource extraout_EAX;
  int iVar38;
  ImGuiNavLayer layer;
  uint uVar39;
  ImGuiContext *g_8;
  ulong uVar40;
  uint *__dest;
  ImGuiInputEvent *__dest_00;
  ImGuiKeyData *pIVar41;
  bool *pbVar42;
  ImGuiKeyRoutingData *pIVar43;
  ImGuiWindow *pIVar44;
  ImGuiContext *pIVar45;
  ImGuiWindowStackData *__dest_01;
  ImGuiPopupData *__dest_02;
  int *piVar46;
  int *piVar47;
  ImGuiGroupData *__dest_03;
  ImGuiStackLevelInfo *__dest_04;
  int n;
  ImGuiDir IVar48;
  ImGuiScrollFlags scroll_flags;
  long lVar49;
  ImGuiWindow *pIVar50;
  int iVar51;
  ImGuiKey key_up;
  byte bVar52;
  ImGuiID IVar53;
  ImGuiDir IVar54;
  ImGuiContext *g_1;
  long lVar55;
  long lVar56;
  ImRect *pIVar57;
  bool *pbVar58;
  int rhs_size;
  int iVar59;
  ImGuiKey key_right;
  uint uVar60;
  char *pcVar61;
  ImGuiKey IVar62;
  ImGuiKey key_left;
  ImFont *font;
  ImGuiKeyRoutingData *this;
  long lVar63;
  ImGuiContext *g;
  ImGuiContext *g_3;
  ImGuiWindow *parent_window;
  ulong uVar64;
  ImGuiWindow *pIVar65;
  ImGuiWindow *child_window;
  ImGuiContext *pIVar66;
  bool bVar67;
  bool bVar68;
  uint uVar69;
  float fVar70;
  ImVec2 IVar71;
  ImVec2 IVar72;
  ImVec2 IVar73;
  ImVec2 IVar74;
  ImVec2 IVar75;
  ImVec4 IVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ImVec2 IVar80;
  ImVec2 IVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar96;
  float fVar84;
  ImVec2 IVar85;
  ImVec2 IVar86;
  int iVar97;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  ImVec2 IVar90;
  float fVar93;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar94;
  float fVar95;
  ImGuiContext *ctx;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float local_88;
  ImRect local_48;
  undefined1 auVar87 [16];
  
  pIVar24 = GImGui;
  uVar40 = (ulong)(GImGui->Hooks).Size;
  if (0 < (long)uVar40) {
    lVar55 = -uVar40;
    uVar64 = uVar40 + 1;
    lVar56 = uVar40 << 5;
    do {
      pIVar12 = (pIVar24->Hooks).Data;
      if (*(int *)(pIVar12 + lVar56 + -0x1c) == 7) {
        memmove(pIVar12 + lVar56 + -0x20,pIVar12 + lVar56,((int)uVar40 + lVar55) * 0x20);
        uVar35 = (pIVar24->Hooks).Size - 1;
        uVar40 = (ulong)uVar35;
        (pIVar24->Hooks).Size = uVar35;
      }
      lVar55 = lVar55 + 1;
      uVar64 = uVar64 - 1;
      lVar56 = lVar56 + -0x20;
    } while (1 < uVar64);
    if (0 < (int)uVar40) {
      lVar56 = 0;
      lVar55 = 0;
      do {
        pIVar12 = (pIVar24->Hooks).Data;
        if (*(int *)(pIVar12 + lVar56 + 4) == 0) {
          (**(code **)(pIVar12 + lVar56 + 0x10))(pIVar24,pIVar12 + lVar56);
          uVar40 = (ulong)(uint)(pIVar24->Hooks).Size;
        }
        lVar55 = lVar55 + 1;
        lVar56 = lVar56 + 0x20;
      } while (lVar55 < (int)uVar40);
    }
  }
  pIVar66 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar66->SettingsLoaded == false) {
    pcVar61 = (pIVar66->IO).IniFilename;
    if (pcVar61 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar61);
    }
    pIVar66->SettingsLoaded = true;
  }
  if ((0.0 < pIVar66->SettingsDirtyTimer) &&
     (fVar70 = pIVar66->SettingsDirtyTimer - (pIVar66->IO).DeltaTime,
     pIVar66->SettingsDirtyTimer = fVar70, fVar70 <= 0.0)) {
    pcVar61 = (pIVar66->IO).IniFilename;
    if (pcVar61 == (char *)0x0) {
      (pIVar66->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar61);
    }
    pIVar66->SettingsDirtyTimer = 0.0;
  }
  fVar70 = (pIVar24->IO).DeltaTime;
  pIVar24->Time = (double)fVar70 + pIVar24->Time;
  pIVar24->WithinFrameScope = true;
  pIVar24->FrameCount = pIVar24->FrameCount + 1;
  pIVar24->TooltipOverrideCount = 0;
  pIVar24->WindowsActiveCount = 0;
  if ((pIVar24->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar13 = (pIVar24->MenusIdSubmittedThisFrame).Data;
    if (puVar13 != (uint *)0x0) {
      memcpy(__dest,puVar13,(long)(pIVar24->MenusIdSubmittedThisFrame).Size << 2);
      puVar13 = (pIVar24->MenusIdSubmittedThisFrame).Data;
      if ((puVar13 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar47 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar13,GImAllocatorUserData);
    }
    (pIVar24->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar24->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar70 = (pIVar24->IO).DeltaTime;
  }
  (pIVar24->MenusIdSubmittedThisFrame).Size = 0;
  pIVar24->FramerateSecPerFrameAccum =
       (fVar70 - pIVar24->FramerateSecPerFrame[pIVar24->FramerateSecPerFrameIdx]) +
       pIVar24->FramerateSecPerFrameAccum;
  pIVar24->FramerateSecPerFrame[pIVar24->FramerateSecPerFrameIdx] = fVar70;
  iVar38 = pIVar24->FramerateSecPerFrameIdx;
  iVar59 = (int)((ulong)((long)(iVar38 + 1) * -0x77777777) >> 0x20) + iVar38 + 1;
  iVar51 = 0x3b;
  if (pIVar24->FramerateSecPerFrameCount < 0x3b) {
    iVar51 = pIVar24->FramerateSecPerFrameCount;
  }
  pIVar24->FramerateSecPerFrameIdx = iVar38 + ((iVar59 >> 5) - (iVar59 >> 0x1f)) * -0x3c + 1;
  pIVar24->FramerateSecPerFrameCount = iVar51 + 1;
  uVar35 = -(uint)(0.0 < pIVar24->FramerateSecPerFrameAccum);
  (pIVar24->IO).Framerate =
       (float)(~uVar35 & 0x7f7fffff |
              (uint)(1.0 / (pIVar24->FramerateSecPerFrameAccum / (float)(iVar51 + 1))) & uVar35);
  pIVar66 = GImGui;
  pIVar14 = *(GImGui->Viewports).Data;
  (pIVar14->super_ImGuiViewport).Flags = 5;
  (pIVar14->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar14->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar14->super_ImGuiViewport).Size = (pIVar66->IO).DisplaySize;
  if (0 < (pIVar66->Viewports).Size) {
    lVar56 = 0;
    do {
      pIVar14 = (pIVar66->Viewports).Data[lVar56];
      IVar80 = pIVar14->BuildWorkOffsetMin;
      pIVar14->WorkOffsetMin = IVar80;
      IVar72 = pIVar14->BuildWorkOffsetMax;
      pIVar14->WorkOffsetMax = IVar72;
      (pIVar14->BuildWorkOffsetMin).x = 0.0;
      (pIVar14->BuildWorkOffsetMin).y = 0.0;
      (pIVar14->BuildWorkOffsetMax).x = 0.0;
      (pIVar14->BuildWorkOffsetMax).y = 0.0;
      IVar71 = (pIVar14->super_ImGuiViewport).Size;
      fVar70 = IVar72.x + (IVar71.x - IVar80.x);
      fVar93 = IVar72.y + (IVar71.y - IVar80.y);
      IVar71 = (pIVar14->super_ImGuiViewport).Pos;
      (pIVar14->super_ImGuiViewport).WorkPos.x = IVar71.x + IVar80.x;
      (pIVar14->super_ImGuiViewport).WorkPos.y = IVar71.y + IVar80.y;
      (pIVar14->super_ImGuiViewport).WorkSize.x = (float)(-(uint)(0.0 < fVar70) & (uint)fVar70);
      (pIVar14->super_ImGuiViewport).WorkSize.y = (float)(-(uint)(0.0 < fVar93) & (uint)fVar93);
      lVar56 = lVar56 + 1;
    } while (lVar56 < (pIVar66->Viewports).Size);
  }
  ((pIVar24->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar56 = (long)(pIVar24->Viewports).Size;
  IVar76 = _DAT_0025adb0;
  if (0 < lVar56) {
    lVar55 = 0;
    do {
      pIVar14 = (pIVar24->Viewports).Data[lVar55];
      fVar70 = (pIVar14->super_ImGuiViewport).Pos.x;
      if (fVar70 < IVar76.x) {
        IVar76.x = fVar70;
      }
      fVar93 = (pIVar14->super_ImGuiViewport).Pos.y;
      if (fVar93 < IVar76.y) {
        IVar76.y = fVar93;
      }
      fVar70 = fVar70 + (pIVar14->super_ImGuiViewport).Size.x;
      if (IVar76.z < fVar70) {
        IVar76.z = fVar70;
      }
      fVar93 = fVar93 + (pIVar14->super_ImGuiViewport).Size.y;
      if (IVar76.w < fVar93) {
        IVar76.w = fVar93;
      }
      lVar55 = lVar55 + 1;
    } while (lVar56 != lVar55);
  }
  (pIVar24->DrawListSharedData).ClipRectFullscreen = IVar76;
  fVar70 = (pIVar24->Style).CircleTessellationMaxError;
  (pIVar24->DrawListSharedData).CurveTessellationTol = (pIVar24->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar24->DrawListSharedData,fVar70);
  bVar31 = (pIVar24->Style).AntiAliasedLines;
  uVar35 = (uint)bVar31;
  (pIVar24->DrawListSharedData).InitialFlags = (uint)bVar31;
  if (((pIVar24->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar24->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar35 = bVar31 | 2;
    (pIVar24->DrawListSharedData).InitialFlags = uVar35;
  }
  if ((pIVar24->Style).AntiAliasedFill == true) {
    uVar35 = uVar35 | 4;
    (pIVar24->DrawListSharedData).InitialFlags = uVar35;
  }
  if (((pIVar24->IO).BackendFlags & 8) != 0) {
    (pIVar24->DrawListSharedData).InitialFlags = uVar35 | 8;
  }
  if (0 < (pIVar24->Viewports).Size) {
    lVar56 = 0;
    do {
      pIVar14 = (pIVar24->Viewports).Data[lVar56];
      (pIVar14->DrawDataP).DisplaySize.x = 0.0;
      (pIVar14->DrawDataP).DisplaySize.y = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar14->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar14->DrawDataP).DisplayPos.x = 0.0;
      (pIVar14->DrawDataP).DisplayPos.y = 0.0;
      (pIVar14->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar14->DrawDataP).field_0x1 = 0;
      (pIVar14->DrawDataP).CmdListsCount = 0;
      (pIVar14->DrawDataP).TotalIdxCount = 0;
      (pIVar14->DrawDataP).TotalVtxCount = 0;
      lVar56 = lVar56 + 1;
    } while (lVar56 < (pIVar24->Viewports).Size);
  }
  pIVar66 = GImGui;
  if ((pIVar24->DragDropActive != false) &&
     (IVar36 = (pIVar24->DragDropPayload).SourceId, IVar36 == pIVar24->ActiveId)) {
    if (GImGui->ActiveId == IVar36) {
      GImGui->ActiveIdIsAlive = IVar36;
    }
    if (pIVar66->ActiveIdPreviousFrame == IVar36) {
      pIVar66->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar24->HoveredIdPreviousFrame == 0) {
    IVar36 = pIVar24->HoveredId;
    pIVar24->HoveredIdTimer = 0.0;
    pIVar24->HoveredIdNotActiveTimer = 0.0;
    if (IVar36 == 0) goto LAB_001e6ef8;
LAB_001e6eb9:
    fVar70 = (pIVar24->IO).DeltaTime;
    pIVar24->HoveredIdTimer = pIVar24->HoveredIdTimer + fVar70;
    if (pIVar24->ActiveId != IVar36) {
      pIVar24->HoveredIdNotActiveTimer = fVar70 + pIVar24->HoveredIdNotActiveTimer;
    }
  }
  else {
    IVar36 = pIVar24->HoveredId;
    if (IVar36 != 0) {
      if (pIVar24->ActiveId == IVar36) {
        pIVar24->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_001e6eb9;
    }
LAB_001e6ef8:
    IVar36 = 0;
  }
  pIVar24->HoveredIdPreviousFrame = IVar36;
  pIVar24->HoveredId = 0;
  pIVar24->HoveredIdAllowOverlap = false;
  pIVar24->HoveredIdDisabled = false;
  IVar36 = pIVar24->ActiveId;
  if (IVar36 == 0) {
    fVar70 = (pIVar24->IO).DeltaTime;
    IVar53 = 0;
  }
  else {
    if ((pIVar24->ActiveIdIsAlive == IVar36) || (pIVar24->ActiveIdPreviousFrame != IVar36)) {
      fVar70 = (pIVar24->IO).DeltaTime;
    }
    else {
      if ((pIVar24->DebugLogFlags & 1) != 0) {
        DebugLog("NewFrame(): ClearActiveID() because it isn\'t marked alive anymore!\n");
      }
      IVar53 = 0;
      SetActiveID(0,(ImGuiWindow *)0x0);
      IVar36 = pIVar24->ActiveId;
      fVar70 = (pIVar24->IO).DeltaTime;
      if (IVar36 == 0) goto LAB_001e6f9e;
    }
    pIVar24->ActiveIdTimer = pIVar24->ActiveIdTimer + fVar70;
    IVar53 = IVar36;
  }
LAB_001e6f9e:
  pIVar24->LastActiveIdTimer = fVar70 + pIVar24->LastActiveIdTimer;
  pIVar24->ActiveIdPreviousFrame = IVar53;
  pIVar24->ActiveIdPreviousFrameWindow = pIVar24->ActiveIdWindow;
  pIVar24->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar24->ActiveIdHasBeenEditedBefore;
  pIVar24->ActiveIdIsAlive = 0;
  pIVar24->ActiveIdHasBeenEditedThisFrame = false;
  pIVar24->ActiveIdPreviousFrameIsAlive = false;
  pIVar24->ActiveIdIsJustActivated = false;
  if (IVar53 != pIVar24->TempInputId && pIVar24->TempInputId != 0) {
    pIVar24->TempInputId = 0;
  }
  pIVar66 = GImGui;
  if (IVar53 == 0) {
    pIVar24->ActiveIdUsingNavDirMask = 0;
    pIVar24->ActiveIdUsingAllKeyboardKeys = false;
    pIVar24->ActiveIdUsingNavInputMask = 0;
  }
  else if ((pIVar24->ActiveIdUsingNavInputMask & 2) != 0) {
    GImGui->KeysOwnerData[0xe].OwnerNext = IVar53;
    pIVar66->KeysOwnerData[0xe].OwnerCurr = IVar53;
    pIVar66->KeysOwnerData[0xe].LockThisFrame = false;
    pIVar66->KeysOwnerData[0xe].LockUntilRelease = false;
  }
  pIVar24->HoverDelayIdPreviousFrame = pIVar24->HoverDelayId;
  if (pIVar24->HoverDelayId == 0) {
    if (0.0 < pIVar24->HoverDelayTimer) {
      fVar70 = (pIVar24->IO).DeltaTime;
      fVar84 = pIVar24->HoverDelayClearTimer + fVar70;
      pIVar24->HoverDelayClearTimer = fVar84;
      fVar93 = 0.2;
      if (0.2 <= fVar70 + fVar70) {
        fVar93 = fVar70 + fVar70;
      }
      if (fVar93 <= fVar84) {
        pIVar24->HoverDelayTimer = 0.0;
        pIVar24->HoverDelayClearTimer = 0.0;
      }
    }
  }
  else {
    pIVar24->HoverDelayTimer = (pIVar24->IO).DeltaTime + pIVar24->HoverDelayTimer;
    pIVar24->HoverDelayClearTimer = 0.0;
    pIVar24->HoverDelayId = 0;
  }
  pIVar24->DragDropAcceptIdPrev = pIVar24->DragDropAcceptIdCurr;
  pIVar24->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar24->DragDropAcceptIdCurr = 0;
  pIVar24->DragDropWithinSource = false;
  pIVar24->DragDropWithinTarget = false;
  pIVar24->DragDropHoldJustPressedId = 0;
  if ((pIVar24->InputEventsTrail).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    __dest_00 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar15 = (pIVar24->InputEventsTrail).Data;
    if (pIVar15 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest_00,pIVar15,(long)(pIVar24->InputEventsTrail).Size * 0x18);
      pIVar15 = (pIVar24->InputEventsTrail).Data;
      if ((pIVar15 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar47 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar24->InputEventsTrail).Data = __dest_00;
    (pIVar24->InputEventsTrail).Capacity = 0;
  }
  (pIVar24->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar24->IO).ConfigInputTrickleEventQueue);
  pIVar66 = GImGui;
  if ((GImGui->IO).BackendUsingLegacyKeyArrays != '\0') {
    lVar56 = 0;
    do {
      lVar55 = (long)(pIVar66->IO).KeyMap[lVar56 + 0x200];
      if (lVar55 != -1) {
        (pIVar66->IO).KeyMap[lVar55] = (int)lVar56 + 0x200;
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != 0x8c);
    uVar40 = 0;
    do {
      while ((bVar31 = (pIVar66->IO).KeysDown[uVar40], bVar31 != false ||
             ((pIVar66->IO).BackendUsingLegacyKeyArrays == '\x01'))) {
        uVar35 = (pIVar66->IO).KeyMap[uVar40];
        uVar64 = uVar40 & 0xffffffff;
        if (uVar35 != 0xffffffff) {
          uVar64 = (ulong)uVar35;
        }
        (pIVar66->IO).KeysData[(int)uVar64].Down = bVar31;
        if (uVar40 != uVar64) {
          (pIVar66->IO).KeysDown[(int)uVar64] = (pIVar66->IO).KeysDown[uVar40];
        }
        (pIVar66->IO).BackendUsingLegacyKeyArrays = '\x01';
        pIVar45 = GImGui;
        uVar40 = uVar40 + 1;
        if (uVar40 == 0x200) {
          (GImGui->IO).KeysData[0x288].Down = (pIVar66->IO).KeyCtrl;
          (pIVar45->IO).KeysData[0x289].Down = (pIVar66->IO).KeyShift;
          (pIVar45->IO).KeysData[0x28a].Down = (pIVar66->IO).KeyAlt;
          (pIVar45->IO).KeysData[0x28b].Down = (pIVar66->IO).KeySuper;
          goto LAB_001e72d0;
        }
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != 0x200);
  }
LAB_001e72d0:
  if (((((pIVar66->IO).ConfigFlags & 2) != 0) &&
      ((pIVar66->IO).BackendUsingLegacyNavInputArray == true)) &&
     (((pIVar66->IO).BackendFlags & 1U) != 0)) {
    fVar70 = (pIVar66->IO).NavInputs[0];
    fVar93 = (pIVar66->IO).NavInputs[1];
    (pIVar66->IO).KeysData[0x26e].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x26e].AnalogValue = fVar70;
    (pIVar66->IO).KeysData[0x26c].Down = 0.0 < fVar93;
    (pIVar66->IO).KeysData[0x26c].AnalogValue = fVar93;
    fVar70 = (pIVar66->IO).NavInputs[3];
    (pIVar66->IO).KeysData[0x26b].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x26b].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[2];
    (pIVar66->IO).KeysData[0x26d].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x26d].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[4];
    (pIVar66->IO).KeysData[0x26f].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x26f].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[5];
    (pIVar66->IO).KeysData[0x270].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x270].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[6];
    (pIVar66->IO).KeysData[0x271].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x271].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[7];
    fVar93 = (pIVar66->IO).NavInputs[8];
    (pIVar66->IO).KeysData[0x272].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x272].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[0xc];
    fVar84 = (pIVar66->IO).NavInputs[0xe];
    (pIVar66->IO).KeysData[0x273].Down = (bool)((-(0.0 < fVar84) | -(0.0 < fVar70)) & 1);
    (pIVar66->IO).KeysData[0x273].AnalogValue =
         (float)(~-(uint)(fVar84 <= fVar70) & (uint)fVar84 |
                (uint)fVar70 & -(uint)(fVar84 <= fVar70));
    fVar70 = (pIVar66->IO).NavInputs[0xd];
    fVar84 = (pIVar66->IO).NavInputs[0xf];
    (pIVar66->IO).KeysData[0x274].Down = (bool)(-(0.0 < fVar70 || 0.0 < fVar84) & 1);
    (pIVar66->IO).KeysData[0x274].AnalogValue =
         (float)(~-(uint)(fVar84 <= fVar70) & (uint)fVar84 |
                (uint)fVar70 & -(uint)(fVar84 <= fVar70));
    (pIVar66->IO).KeysData[0x279].Down = 0.0 < fVar93;
    (pIVar66->IO).KeysData[0x279].AnalogValue = fVar93;
    fVar70 = (pIVar66->IO).NavInputs[9];
    (pIVar66->IO).KeysData[0x27a].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x27a].AnalogValue = fVar70;
    fVar70 = (pIVar66->IO).NavInputs[10];
    fVar93 = (pIVar66->IO).NavInputs[0xb];
    (pIVar66->IO).KeysData[0x27b].Down = 0.0 < fVar70;
    (pIVar66->IO).KeysData[0x27b].AnalogValue = fVar70;
    (pIVar66->IO).KeysData[0x27c].Down = 0.0 < fVar93;
    (pIVar66->IO).KeysData[0x27c].AnalogValue = fVar93;
  }
  iVar38 = (uint)(GImGui->IO).KeyCtrl * 0x1000;
  iVar51 = iVar38 + 0x2000;
  if ((GImGui->IO).KeyShift == false) {
    iVar51 = iVar38;
  }
  iVar38 = iVar51 + 0x4000;
  if ((GImGui->IO).KeyAlt == false) {
    iVar38 = iVar51;
  }
  iVar51 = iVar38 + 0x8000;
  if ((GImGui->IO).KeySuper == false) {
    iVar51 = iVar38;
  }
  (pIVar66->IO).KeyMods = iVar51;
  lVar56 = -5;
  do {
    bVar31 = (pIVar66->IO).MouseDown[lVar56 + 5];
    fVar70 = 1.0;
    if (bVar31 == false) {
      fVar70 = 0.0;
    }
    IVar62 = (int)lVar56 + ImGuiKey_MouseWheelX;
    this = (ImGuiKeyRoutingData *)(ulong)IVar62;
    pIVar41 = GetKeyData(IVar62);
    pIVar41->Down = bVar31;
    pIVar41->AnalogValue = fVar70;
    pIVar45 = GImGui;
    lVar56 = lVar56 + 1;
  } while (lVar56 != 0);
  fVar70 = (pIVar66->IO).MouseWheelH;
  (GImGui->IO).KeysData[0x286].Down = fVar70 != 0.0;
  (pIVar45->IO).KeysData[0x286].AnalogValue = fVar70;
  fVar70 = (pIVar66->IO).MouseWheel;
  (pIVar45->IO).KeysData[0x287].Down = fVar70 != 0.0;
  (pIVar45->IO).KeysData[0x287].AnalogValue = fVar70;
  if (((pIVar66->IO).BackendFlags & 1) == 0) {
    lVar56 = 0;
    do {
      (&(pIVar66->IO).KeysData[0x269].Down)[lVar56] = false;
      *(undefined4 *)((long)&(pIVar66->IO).KeysData[0x269].AnalogValue + lVar56) = 0;
      lVar56 = lVar56 + 0x10;
    } while (lVar56 != 0x180);
  }
  lVar56 = 0xe24;
  do {
    fVar70 = *(float *)((long)pIVar66 + lVar56 + -4);
    *(float *)(&pIVar66->Initialized + lVar56) = fVar70;
    fVar93 = -1.0;
    if ((*(char *)((long)pIVar66 + lVar56 + -8) == '\x01') && (fVar93 = 0.0, 0.0 <= fVar70)) {
      fVar93 = fVar70 + (pIVar66->IO).DeltaTime;
    }
    *(float *)((long)pIVar66 + lVar56 + -4) = fVar93;
    lVar56 = lVar56 + 0x10;
  } while (lVar56 != 0x36e4);
  pbVar42 = &pIVar66->KeysOwnerData[0].LockUntilRelease;
  lVar56 = 0;
  do {
    ((ImGuiKeyOwnerData *)(pbVar42 + -9))->OwnerCurr = *(ImGuiID *)(pbVar42 + -5);
    if ((&(pIVar66->IO).KeysData[0x200].Down)[lVar56] == false) {
      *(ImGuiID *)(pbVar42 + -5) = 0xffffffff;
    }
    if (*pbVar42 == true) {
      bVar31 = (&(pIVar66->IO).KeysData[0x200].Down)[lVar56];
    }
    else {
      bVar31 = false;
    }
    *pbVar42 = bVar31;
    pbVar42[-1] = bVar31;
    pIVar45 = GImGui;
    lVar56 = lVar56 + 0x10;
    pbVar42 = pbVar42 + 0xc;
  } while (lVar56 != 0x8c0);
  if ((pIVar66->KeysRoutingTable).EntriesNext.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    this = (ImGuiKeyRoutingData *)0x0;
    pIVar43 = (ImGuiKeyRoutingData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar16 = (pIVar66->KeysRoutingTable).EntriesNext.Data;
    if (pIVar16 != (ImGuiKeyRoutingData *)0x0) {
      memcpy(pIVar43,pIVar16,(long)(pIVar66->KeysRoutingTable).EntriesNext.Size << 4);
      this = (pIVar66->KeysRoutingTable).EntriesNext.Data;
      if ((this != (ImGuiKeyRoutingData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar47 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + -1;
      }
      (*GImAllocatorFreeFunc)(this,GImAllocatorUserData);
    }
    (pIVar66->KeysRoutingTable).EntriesNext.Data = pIVar43;
    (pIVar66->KeysRoutingTable).EntriesNext.Capacity = 0;
  }
  (pIVar66->KeysRoutingTable).EntriesNext.Size = 0;
  lVar56 = 0x200;
  uVar40 = 0;
  do {
    sVar33 = *(short *)(&pIVar66->KeysOwnerData[0x36].LockThisFrame + lVar56 * 2);
    iVar51 = (int)uVar40;
    iVar38 = iVar51;
    if (sVar33 != -1) {
      do {
        pIVar43 = (pIVar66->KeysRoutingTable).Entries.Data;
        pIVar16 = pIVar43 + sVar33;
        IVar36 = pIVar43[sVar33].RoutingNext;
        pIVar43[sVar33].RoutingCurr = IVar36;
        pIVar43[sVar33].RoutingNext = 0xffffffff;
        pIVar43[sVar33].RoutingNextScore = 0xff;
        if (IVar36 != 0xffffffff) {
          iVar38 = (pIVar66->KeysRoutingTable).EntriesNext.Size;
          if (iVar38 == (pIVar66->KeysRoutingTable).EntriesNext.Capacity) {
            if (iVar38 == 0) {
              iVar59 = 8;
            }
            else {
              iVar59 = iVar38 / 2 + iVar38;
            }
            iVar22 = iVar38 + 1;
            if (iVar38 + 1 < iVar59) {
              iVar22 = iVar59;
            }
            if (GImGui != (ImGuiContext *)0x0) {
              piVar47 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar47 = *piVar47 + 1;
            }
            this = (ImGuiKeyRoutingData *)((long)iVar22 << 4);
            pIVar43 = (ImGuiKeyRoutingData *)
                      (*GImAllocatorAllocFunc)((size_t)this,GImAllocatorUserData);
            __src = (pIVar66->KeysRoutingTable).EntriesNext.Data;
            if (__src != (ImGuiKeyRoutingData *)0x0) {
              memcpy(pIVar43,__src,(long)(pIVar66->KeysRoutingTable).EntriesNext.Size << 4);
              this = (pIVar66->KeysRoutingTable).EntriesNext.Data;
              if ((this != (ImGuiKeyRoutingData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar47 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar47 = *piVar47 + -1;
              }
              (*GImAllocatorFreeFunc)(this,GImAllocatorUserData);
            }
            (pIVar66->KeysRoutingTable).EntriesNext.Data = pIVar43;
            (pIVar66->KeysRoutingTable).EntriesNext.Capacity = iVar22;
            iVar38 = (pIVar66->KeysRoutingTable).EntriesNext.Size;
          }
          else {
            pIVar43 = (pIVar66->KeysRoutingTable).EntriesNext.Data;
          }
          IVar25 = pIVar16->Mods;
          IVar32 = pIVar16->RoutingNextScore;
          uVar26 = *(undefined3 *)&pIVar16->field_0x5;
          IVar36 = pIVar16->RoutingCurr;
          IVar53 = pIVar16->RoutingNext;
          pIVar43 = pIVar43 + iVar38;
          pIVar43->NextEntryIndex = pIVar16->NextEntryIndex;
          pIVar43->Mods = IVar25;
          pIVar43->RoutingNextScore = IVar32;
          *(undefined3 *)&pIVar43->field_0x5 = uVar26;
          pIVar43->RoutingCurr = IVar36;
          pIVar43->RoutingNext = IVar53;
          pIVar1 = &(pIVar66->KeysRoutingTable).EntriesNext;
          pIVar1->Size = pIVar1->Size + 1;
          if (((pIVar45->IO).KeyMods == (uint)pIVar16->Mods) &&
             ((&(GImGui->IO).KeysData[0x191].DownDuration)[lVar56 * 3] == -NAN)) {
            (&(GImGui->IO).KeysData[0x191].DownDuration)[lVar56 * 3] = (float)pIVar16->RoutingCurr;
          }
        }
        sVar33 = pIVar16->NextEntryIndex;
      } while (sVar33 != -1);
      iVar38 = (pIVar66->KeysRoutingTable).EntriesNext.Size;
    }
    uVar34 = 0xffff;
    if (iVar51 < iVar38) {
      uVar34 = (undefined2)uVar40;
    }
    *(undefined2 *)(&pIVar66->KeysOwnerData[0x36].LockThisFrame + lVar56 * 2) = uVar34;
    uVar35 = (pIVar66->KeysRoutingTable).EntriesNext.Size;
    if (iVar51 < (int)uVar35) {
      lVar55 = (long)iVar51;
      lVar49 = lVar55 << 4;
      uVar40 = (ulong)uVar35;
      do {
        iVar51 = iVar51 + 1;
        uVar34 = (undefined2)iVar51;
        lVar55 = lVar55 + 1;
        if ((int)uVar40 <= lVar55) {
          uVar34 = 0xffff;
        }
        this = (pIVar66->KeysRoutingTable).EntriesNext.Data;
        *(undefined2 *)((long)&this->NextEntryIndex + lVar49) = uVar34;
        uVar40 = (ulong)(pIVar66->KeysRoutingTable).EntriesNext.Size;
        lVar49 = lVar49 + 0x10;
      } while (lVar55 < (long)uVar40);
    }
    else {
      uVar40 = (ulong)uVar35;
    }
    lVar56 = lVar56 + 1;
  } while (lVar56 != 0x28c);
  iVar38 = (pIVar66->KeysRoutingTable).EntriesNext.Capacity;
  iVar51 = (pIVar66->KeysRoutingTable).Entries.Size;
  iVar59 = (pIVar66->KeysRoutingTable).Entries.Capacity;
  pIVar16 = (pIVar66->KeysRoutingTable).Entries.Data;
  (pIVar66->KeysRoutingTable).Entries.Size = (int)uVar40;
  (pIVar66->KeysRoutingTable).EntriesNext.Size = iVar51;
  (pIVar66->KeysRoutingTable).EntriesNext.Capacity = iVar59;
  (pIVar66->KeysRoutingTable).Entries.Capacity = iVar38;
  pIVar43 = (pIVar66->KeysRoutingTable).EntriesNext.Data;
  (pIVar66->KeysRoutingTable).EntriesNext.Data = pIVar16;
  (pIVar66->KeysRoutingTable).Entries.Data = pIVar43;
  pIVar66 = GImGui;
  (GImGui->IO).WantSetMousePos = false;
  uVar35 = (pIVar66->IO).ConfigFlags;
  if (((uVar35 & 2) == 0) || (((pIVar66->IO).BackendFlags & 1) == 0)) {
    bVar31 = false;
  }
  else {
    lVar56 = 0;
    do {
      this = (ImGuiKeyRoutingData *)(ulong)*(ImGuiKey *)((long)&DAT_0025e2f0 + lVar56);
      bVar31 = IsKeyDown(*(ImGuiKey *)((long)&DAT_0025e2f0 + lVar56));
      if (bVar31) {
        pIVar66->NavInputSource = ImGuiInputSource_Gamepad;
      }
      lVar56 = lVar56 + 4;
    } while (lVar56 != 0x20);
    bVar31 = true;
  }
  if ((uVar35 & 1) != 0) {
    lVar56 = 0;
    do {
      this = (ImGuiKeyRoutingData *)(ulong)*(ImGuiKey *)((long)&DAT_0025b990 + lVar56);
      bVar28 = IsKeyDown(*(ImGuiKey *)((long)&DAT_0025b990 + lVar56));
      if (bVar28) {
        pIVar66->NavInputSource = ImGuiInputSource_Keyboard;
      }
      lVar56 = lVar56 + 4;
    } while (lVar56 != 0x1c);
  }
  if (pIVar66->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar66->NavInitRequest = false;
  pIVar66->NavInitRequestFromMove = false;
  pIVar66->NavInitResultId = 0;
  pIVar66->NavJustMovedToId = 0;
  if (pIVar66->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult((ImGui *)this);
  }
  pIVar66->NavTabbingCounter = 0;
  pIVar66->NavMoveSubmitted = false;
  pIVar66->NavMoveScoringItems = false;
  if ((((pIVar66->NavMousePosDirty == true) && (pIVar66->NavIdIsAlive == true)) &&
      (pIVar66->NavDisableHighlight == false)) && (pIVar66->NavDisableMouseHover == true)) {
    bVar28 = pIVar66->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar28 = false;
  }
  pIVar66->NavMousePosDirty = false;
  pIVar44 = pIVar66->NavWindow;
  pIVar50 = pIVar44;
  if (pIVar44 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar50->RootWindow == pIVar50) || ((pIVar50->Flags & 0x14000000) != 0)) {
        if (pIVar50 != pIVar44) {
          pIVar50->NavLastChildNavWindow = pIVar44;
          pIVar44 = pIVar66->NavWindow;
        }
        break;
      }
      ppIVar2 = &pIVar50->ParentWindow;
      pIVar50 = *ppIVar2;
    } while (*ppIVar2 != (ImGuiWindow *)0x0);
    if (((pIVar44 != (ImGuiWindow *)0x0) && (pIVar44->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar66->NavLayer == ImGuiNavLayer_Main)) {
      pIVar44->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar45 = GImGui;
  pIVar44 = GetTopMostPopupModal();
  if (pIVar44 != (ImGuiWindow *)0x0) {
    pIVar45->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar45->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar70 = (pIVar45->IO).DeltaTime * -10.0 + pIVar45->NavWindowingHighlightAlpha;
    fVar70 = (float)(-(uint)(0.0 <= fVar70) & (uint)fVar70);
    pIVar45->NavWindowingHighlightAlpha = fVar70;
    if ((pIVar45->DimBgRatio <= 0.0) && (fVar70 <= 0.0)) {
      pIVar45->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  uVar39 = (pIVar45->IO).ConfigFlags;
  bVar67 = true;
  if ((uVar39 & 2) != 0) {
    bVar67 = ((pIVar45->IO).BackendFlags & 1) == 0;
  }
  bVar68 = false;
  bVar29 = false;
  bVar30 = false;
  bVar52 = 0;
  if (pIVar44 == (ImGuiWindow *)0x0) {
    if (pIVar45->ConfigNavWindowingKeyNext == 0) {
      bVar29 = false;
    }
    else {
      bVar29 = Shortcut(pIVar45->ConfigNavWindowingKeyNext,0xffffffff,0x1001);
    }
    if (pIVar45->ConfigNavWindowingKeyPrev == 0) {
      bVar30 = false;
    }
    else {
      bVar30 = Shortcut(pIVar45->ConfigNavWindowingKeyPrev,0xffffffff,0x1001);
    }
    bVar68 = pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0;
    if ((bool)(~bVar68 & 1) || bVar67 != false) {
      bVar52 = bVar67 & bVar68;
      bVar68 = false;
    }
    else {
      bVar68 = IsKeyPressed(ImGuiKey_GamepadFaceLeft,0,0);
      bVar52 = 1;
    }
    bVar52 = (bVar29 | bVar30) & bVar52;
  }
  if (((bVar68 != false) || (bVar52 != 0)) &&
     ((pIVar44 = pIVar45->NavWindow, pIVar44 != (ImGuiWindow *)0x0 ||
      (pIVar44 = FindWindowNavFocusable((pIVar45->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar44 != (ImGuiWindow *)0x0)))) {
    pIVar44 = pIVar44->RootWindow;
    pIVar45->NavWindowingTargetAnim = pIVar44;
    pIVar45->NavWindowingTarget = pIVar44;
    pIVar45->NavWindowingTimer = 0.0;
    pIVar45->NavWindowingHighlightAlpha = 0.0;
    (pIVar45->NavWindowingAccumDeltaPos).x = 0.0;
    (pIVar45->NavWindowingAccumDeltaPos).y = 0.0;
    (pIVar45->NavWindowingAccumDeltaSize).x = 0.0;
    (pIVar45->NavWindowingAccumDeltaSize).y = 0.0;
    pIVar45->NavWindowingToggleLayer = bVar68;
    pIVar45->NavInputSource = bVar52 ^ ImGuiInputSource_Gamepad;
  }
  fVar70 = (pIVar45->IO).DeltaTime + pIVar45->NavWindowingTimer;
  pIVar45->NavWindowingTimer = fVar70;
  pIVar44 = pIVar45->NavWindowingTarget;
  if (pIVar44 == (ImGuiWindow *)0x0) {
LAB_001e7e4c:
    pIVar50 = (ImGuiWindow *)0x0;
    pIVar44 = (ImGuiWindow *)0x0;
  }
  else {
    IVar37 = pIVar45->NavInputSource;
    if (IVar37 != ImGuiInputSource_Gamepad) {
LAB_001e7dc1:
      if (IVar37 == ImGuiInputSource_Keyboard) {
        fVar93 = (pIVar45->NavWindowingTimer + -0.2) / 0.05;
        fVar70 = 1.0;
        if (fVar93 <= 1.0) {
          fVar70 = fVar93;
        }
        fVar70 = (float)(~-(uint)(fVar93 < 0.0) & (uint)fVar70);
        uVar69 = -(uint)(fVar70 <= pIVar45->NavWindowingHighlightAlpha);
        pIVar45->NavWindowingHighlightAlpha =
             (float)(uVar69 & (uint)pIVar45->NavWindowingHighlightAlpha | ~uVar69 & (uint)fVar70);
        if ((bVar30 | bVar29) != 1) {
          uVar60 = pIVar45->ConfigNavWindowingKeyNext & 0xf000;
          uVar69 = pIVar45->ConfigNavWindowingKeyPrev;
          if (pIVar45->ConfigNavWindowingKeyPrev == 0) {
            uVar69 = 0xf000;
          }
          if (pIVar45->ConfigNavWindowingKeyNext == 0) {
            uVar60 = 0xf000;
          }
          pIVar50 = (ImGuiWindow *)0x0;
          if ((uVar60 & uVar69 & ~(pIVar45->IO).KeyMods) == 0) {
            pIVar44 = pIVar50;
          }
          goto LAB_001e7e51;
        }
        NavUpdateWindowingHighlightWindow(-(uint)bVar29 | 1);
      }
      goto LAB_001e7e4c;
    }
    fVar93 = (fVar70 + -0.2) / 0.05;
    local_88 = 1.0;
    fVar70 = 1.0;
    if (fVar93 <= 1.0) {
      fVar70 = fVar93;
    }
    fVar70 = (float)(~-(uint)(fVar93 < 0.0) & (uint)fVar70);
    uVar69 = -(uint)(fVar70 <= pIVar45->NavWindowingHighlightAlpha);
    fVar70 = (float)(uVar69 & (uint)pIVar45->NavWindowingHighlightAlpha | ~uVar69 & (uint)fVar70);
    pIVar45->NavWindowingHighlightAlpha = fVar70;
    bVar67 = IsKeyPressed(ImGuiKey_GamepadL1,0,1);
    bVar68 = IsKeyPressed(ImGuiKey_GamepadR1,0,1);
    if ((uint)bVar67 - (uint)bVar68 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar67 - (uint)bVar68);
      pIVar45->NavWindowingHighlightAlpha = 1.0;
      fVar70 = local_88;
    }
    local_88 = fVar70;
    bVar67 = IsKeyDown(ImGuiKey_GamepadFaceLeft);
    if (bVar67) {
      pIVar44 = pIVar45->NavWindowingTarget;
      if (pIVar44 == (ImGuiWindow *)0x0) goto LAB_001e7e4c;
      IVar37 = pIVar45->NavInputSource;
      goto LAB_001e7dc1;
    }
    pbVar42 = &pIVar45->NavWindowingToggleLayer;
    *pbVar42 = (bool)(*pbVar42 & local_88 < 1.0);
    if (*pbVar42 == false) {
      pIVar44 = pIVar45->NavWindowingTarget;
      pIVar50 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar50 = (ImGuiWindow *)(ulong)(pIVar45->NavWindow != (ImGuiWindow *)0x0);
      pIVar44 = (ImGuiWindow *)0x0;
    }
    pIVar45->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_001e7e51:
  if (((uVar39 & 1) != 0) && (bVar67 = IsKeyPressed(ImGuiKey_ModAlt,0xffffffff,0), bVar67)) {
    pIVar45->NavWindowingToggleLayer = true;
    pIVar45->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar45->NavWindowingToggleLayer == true) &&
     (pIVar45->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar45->IO).InputQueueCharacters.Size) ||
        ((((pIVar45->IO).KeyCtrl != false || ((pIVar45->IO).KeyShift != false)) ||
         ((pIVar45->IO).KeySuper != false)))) ||
       (bVar67 = true, GImGui->KeysOwnerData[0x8a].OwnerCurr != 0xffffffff)) {
      pIVar45->NavWindowingToggleLayer = false;
      bVar67 = false;
    }
    bVar29 = IsKeyReleased(ImGuiKey_ModAlt,0);
    if (((bVar29) && (bVar67)) &&
       ((pIVar45->ActiveId == 0 || (pIVar45->ActiveIdAllowOverlap == true)))) {
      pIVar50 = (ImGuiWindow *)
                (ulong)(byte)(-(((pIVar45->IO).MousePosPrev.y < -256000.0 ||
                                (pIVar45->IO).MousePosPrev.x < -256000.0) !=
                               (-256000.0 <= (pIVar45->IO).MousePos.x &&
                               -256000.0 <= (pIVar45->IO).MousePos.y)) | (byte)pIVar50);
    }
    bVar67 = IsKeyDown(ImGuiKey_ModAlt);
    if (!bVar67) {
      pIVar45->NavWindowingToggleLayer = false;
    }
  }
  pIVar65 = pIVar45->NavWindowingTarget;
  if ((pIVar65 != (ImGuiWindow *)0x0) && ((pIVar65->Flags & 4) == 0)) {
    IVar37 = pIVar45->NavInputSource;
    if (IVar37 == ImGuiInputSource_Gamepad) {
      key_left = ImGuiKey_GamepadLStickLeft;
      key_right = ImGuiKey_GamepadLStickRight;
      key_up = ImGuiKey_GamepadLStickUp;
      IVar62 = ImGuiKey_GamepadLStickDown;
LAB_001e800c:
      IVar71 = GetKeyVector2d(key_left,key_right,key_up,IVar62);
      IVar37 = extraout_EAX;
    }
    else {
      IVar71.x = 0.0;
      IVar71.y = 0.0;
      if ((IVar37 == ImGuiInputSource_Keyboard) && ((pIVar45->IO).KeyShift == false)) {
        key_left = ImGuiKey_LeftArrow;
        key_right = ImGuiKey_RightArrow;
        key_up = ImGuiKey_UpArrow;
        IVar62 = ImGuiKey_DownArrow;
        goto LAB_001e800c;
      }
    }
    fVar70 = IVar71.y;
    if (((IVar71.x != 0.0) || (fVar70 != 0.0)) || (NAN(fVar70))) {
      fVar93 = (pIVar45->IO).DisplayFramebufferScale.x;
      fVar84 = (pIVar45->IO).DisplayFramebufferScale.y;
      if (fVar84 <= fVar93) {
        fVar93 = fVar84;
      }
      fVar93 = fVar93 * (pIVar45->IO).DeltaTime * 800.0;
      pIVar45->NavDisableMouseHover = true;
      IVar80.x = (pIVar45->NavWindowingAccumDeltaPos).x + IVar71.x * fVar93;
      IVar80.y = (pIVar45->NavWindowingAccumDeltaPos).y + fVar70 * fVar93;
      pIVar45->NavWindowingAccumDeltaPos = IVar80;
      iVar51 = (int)IVar80.x;
      iVar59 = (int)IVar80.y;
      auVar83._0_4_ = -(uint)(iVar51 == 0);
      auVar83._4_4_ = -(uint)(iVar51 == 0);
      auVar83._8_4_ = -(uint)(iVar59 == 0);
      auVar83._12_4_ = -(uint)(iVar59 == 0);
      iVar38 = movmskpd(IVar37,auVar83);
      if (iVar38 != 3) {
        IVar71 = pIVar65->RootWindow->Pos;
        local_48.Min.x = IVar71.x + (float)iVar51;
        local_48.Min.y = IVar71.y + (float)iVar59;
        SetWindowPos(pIVar65->RootWindow,&local_48.Min,1);
        IVar72.x = (pIVar45->NavWindowingAccumDeltaPos).x - (float)iVar51;
        IVar72.y = (pIVar45->NavWindowingAccumDeltaPos).y - (float)iVar59;
        pIVar45->NavWindowingAccumDeltaPos = IVar72;
      }
    }
  }
  if (pIVar44 != (ImGuiWindow *)0x0) {
    if ((pIVar45->NavWindow == (ImGuiWindow *)0x0) || (pIVar44 != pIVar45->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar27 = GImGui;
      pIVar27->NavMousePosDirty = true;
      pIVar27->NavDisableHighlight = false;
      pIVar27->NavDisableMouseHover = true;
      pIVar65 = pIVar44->NavLastChildNavWindow;
      if ((pIVar65 == (ImGuiWindow *)0x0) || (pIVar65->WasActive == false)) {
        pIVar65 = pIVar44;
      }
      ClosePopupsOverWindow(pIVar65,false);
      FocusWindow(pIVar65);
      if (pIVar65->NavLastIds[0] == 0) {
        NavInitWindow(pIVar65,false);
      }
      if ((pIVar65->DC).NavLayersActiveMaskNext == 2) {
        pIVar45->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar45->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((ulong)pIVar50 & 1) != 0) && (pIVar45->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar44 = pIVar45->NavWindow;
    pIVar50 = pIVar44;
    do {
      pIVar65 = pIVar50;
      if ((pIVar65->ParentWindow == (ImGuiWindow *)0x0) ||
         (((pIVar65->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar50 = pIVar65->ParentWindow;
    } while ((pIVar65->Flags & 0x15000000U) == 0x1000000);
    if (pIVar65 != pIVar44) {
      FocusWindow(pIVar65);
      pIVar65->NavLastChildNavWindow = pIVar44;
      pIVar44 = pIVar45->NavWindow;
    }
    IVar11 = pIVar45->NavLayer;
    if (((pIVar44->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar11 == ImGuiNavLayer_Main) goto LAB_001e826c;
    }
    else if (IVar11 == ImGuiNavLayer_Main) {
      pIVar44->NavLastIds[1] = 0;
      layer = ImGuiNavLayer_Menu;
    }
    else {
      layer = IVar11 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar45 = GImGui;
    pIVar45->NavMousePosDirty = true;
    pIVar45->NavDisableHighlight = false;
    pIVar45->NavDisableMouseHover = true;
  }
LAB_001e826c:
  if (((uVar35 & 1) == 0 && !bVar31) || (pIVar66->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar66->IO).NavActive = false;
LAB_001e82bd:
    bVar67 = pIVar66->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar67 = (pIVar66->NavWindow->Flags & 0x40000U) == 0;
    (pIVar66->IO).NavActive = bVar67;
    if (((!bVar67) || (pIVar66->NavId == 0)) ||
       (bVar67 = true, pIVar66->NavDisableHighlight != false)) goto LAB_001e82bd;
  }
  (pIVar66->IO).NavVisible = bVar67;
  pIVar45 = GImGui;
  uVar39 = (GImGui->IO).ConfigFlags;
  if ((uVar39 & 2) == 0) {
    bVar52 = 0;
  }
  else {
    bVar52 = (byte)(GImGui->IO).BackendFlags & 1;
  }
  if ((((uVar39 & 1) != 0) && (bVar67 = IsKeyPressed(ImGuiKey_Escape,0xffffffff,0), bVar67)) ||
     ((bVar52 != 0 && (bVar67 = IsKeyPressed(ImGuiKey_GamepadFaceRight,0xffffffff,0), bVar67)))) {
    if ((pIVar45->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavUpdateCancelRequest()\n");
    }
    if (pIVar45->ActiveId == 0) {
      if (pIVar45->NavLayer == ImGuiNavLayer_Main) {
        pIVar44 = pIVar45->NavWindow;
        if (((pIVar44 == (ImGuiWindow *)0x0) || (pIVar44 == pIVar44->RootWindow)) ||
           (((pIVar44->Flags & 0x4000000) != 0 ||
            (pIVar50 = pIVar44->ParentWindow, pIVar50 == (ImGuiWindow *)0x0)))) {
          iVar38 = (pIVar45->OpenPopupStack).Size;
          if ((((long)iVar38 < 1) ||
              (pIVar50 = (pIVar45->OpenPopupStack).Data[(long)iVar38 + -1].Window,
              pIVar50 == (ImGuiWindow *)0x0)) || ((pIVar50->Flags & 0x8000000) != 0)) {
            if ((pIVar44 != (ImGuiWindow *)0x0) && ((pIVar44->Flags & 0x5000000U) != 0x1000000)) {
              pIVar44->NavLastIds[0] = 0;
            }
            pIVar45->NavId = 0;
          }
          else {
            ClosePopupToLevel(iVar38 + -1,true);
          }
        }
        else {
          IVar71 = pIVar44->Size;
          fVar84 = (pIVar44->Pos).x;
          fVar94 = (pIVar44->Pos).y;
          FocusWindow(pIVar50);
          pIVar45 = GImGui;
          IVar36 = pIVar44->ChildId;
          IVar80 = (pIVar50->DC).CursorStartPos;
          fVar70 = IVar80.x;
          IVar81.x = fVar84 - fVar70;
          fVar93 = IVar80.y;
          IVar81.y = fVar94 - fVar93;
          IVar85.x = (IVar71.x + fVar84) - fVar70;
          IVar85.y = (IVar71.y + fVar94) - fVar93;
          GImGui->NavId = IVar36;
          pIVar45->NavLayer = ImGuiNavLayer_Main;
          pIVar45->NavFocusScopeId = 0;
          pIVar45->NavWindow->NavLastIds[0] = IVar36;
          pIVar44 = pIVar45->NavWindow;
          pIVar44->NavRectRel[0].Min = IVar81;
          pIVar44->NavRectRel[0].Max = IVar85;
          pIVar45->NavMousePosDirty = true;
          pIVar45->NavDisableHighlight = false;
          pIVar45->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar45 = GImGui;
        pIVar45->NavMousePosDirty = true;
        pIVar45->NavDisableHighlight = false;
        pIVar45->NavDisableMouseHover = true;
      }
    }
    else {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar66->NavActivateId = 0;
  pIVar66->NavActivateDownId = 0;
  pIVar66->NavActivatePressedId = 0;
  pIVar66->NavActivateInputId = 0;
  pIVar66->NavActivateFlags = 0;
  IVar36 = pIVar66->NavId;
  if (((IVar36 == 0) || (pIVar66->NavDisableHighlight != false)) ||
     (pIVar66->NavWindowingTarget != (ImGuiWindow *)0x0)) goto LAB_001e84e3;
  if (pIVar66->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar66->NavWindow->Flags & 0x40000) == 0) {
      if ((uVar35 & 1) == 0) {
        if (bVar31) {
          bVar67 = IsKeyDown(ImGuiKey_GamepadFaceDown);
          if (bVar67) {
            bVar29 = IsKeyPressed(ImGuiKey_GamepadFaceDown,0,0);
          }
          else {
            bVar29 = false;
          }
          bVar30 = IsKeyDown(ImGuiKey_GamepadFaceUp);
          if (bVar30) goto LAB_001ea16c;
          goto LAB_001ea17c;
        }
      }
      else {
        bVar67 = IsKeyDown(ImGuiKey_Space);
        bVar30 = (bool)(bVar31 ^ 1);
        if (!bVar67 && !bVar30) {
          bVar67 = IsKeyDown(ImGuiKey_GamepadFaceDown);
        }
        if (bVar67 == false) {
          bVar29 = false;
          bVar67 = false;
        }
        else {
          bVar29 = IsKeyPressed(ImGuiKey_Space,0,0);
          bVar67 = true;
          if (!bVar29 && !bVar30) {
            bVar29 = IsKeyPressed(ImGuiKey_GamepadFaceDown,0,0);
          }
        }
        bVar68 = IsKeyDown(ImGuiKey_Enter);
        if (!bVar68 && !bVar30) {
          bVar68 = IsKeyDown(ImGuiKey_GamepadFaceUp);
        }
        if (bVar68 == false) {
LAB_001ea17c:
          bVar68 = false;
        }
        else {
          bVar68 = IsKeyPressed(ImGuiKey_Enter,0,0);
          if (!bVar30 && !bVar68) {
LAB_001ea16c:
            bVar68 = IsKeyPressed(ImGuiKey_GamepadFaceUp,0,0);
          }
        }
        IVar53 = pIVar66->ActiveId;
        if (bVar29 == true && IVar53 == 0) {
          pIVar66->NavActivateId = IVar36;
          pIVar66->NavActivateFlags = 2;
          bVar29 = true;
LAB_001ea1f5:
          if (bVar68 != false) {
            pIVar66->NavActivateInputId = IVar36;
            pIVar66->NavActivateFlags = 1;
          }
          if (bVar67 != false) {
            pIVar66->NavActivateDownId = IVar36;
          }
        }
        else {
          if (IVar53 == 0) goto LAB_001ea1f5;
          if ((bVar68 & IVar53 == IVar36) != 0) {
            pIVar66->NavActivateInputId = IVar36;
            pIVar66->NavActivateFlags = 1;
          }
          if ((bVar67 & IVar53 == IVar36) != 0) {
            pIVar66->NavActivateDownId = IVar36;
          }
          bVar29 = (bool)(bVar29 & IVar53 == IVar36);
        }
        if (bVar29 != false) {
          pIVar66->NavActivatePressedId = IVar36;
        }
      }
    }
LAB_001e84e3:
    if ((pIVar66->NavWindow != (ImGuiWindow *)0x0) && ((pIVar66->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar66->NavDisableHighlight = true;
    }
  }
  IVar36 = pIVar66->NavNextActivateId;
  if (IVar36 != 0) {
    if ((pIVar66->NavNextActivateFlags & 1U) == 0) {
      pIVar66->NavActivatePressedId = IVar36;
      pIVar66->NavActivateDownId = IVar36;
      pIVar66->NavActivateId = IVar36;
    }
    else {
      pIVar66->NavActivateInputId = IVar36;
    }
    pIVar66->NavActivateFlags = pIVar66->NavNextActivateFlags;
  }
  pIVar66->NavNextActivateId = 0;
  pIVar45 = GImGui;
  pIVar44 = GImGui->NavWindow;
  uVar39 = (GImGui->IO).ConfigFlags;
  if ((uVar39 & 2) == 0) {
    bVar52 = 0;
  }
  else {
    bVar52 = (byte)(GImGui->IO).BackendFlags & 1;
  }
  if ((pIVar44 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavMoveRequestForward %d\n",(ulong)(uint)GImGui->NavMoveDir);
    }
LAB_001e8758:
    pIVar27 = GImGui;
    fVar70 = 0.0;
    if (((((uVar39 & 1) != 0) && (pIVar45->NavMoveDir == -1)) &&
        (pIVar50 = GImGui->NavWindow, (pIVar50->Flags & 0x40000) == 0)) &&
       (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      if (((GImGui->IO).KeysData[0x205].Down == true) &&
         ((GImGui->ActiveIdUsingAllKeyboardKeys != true || (GImGui->ActiveId == 0xffffffff)))) {
        bVar67 = GImGui->KeysOwnerData[5].OwnerCurr == 0xffffffff;
      }
      else {
        bVar67 = false;
      }
      if (((GImGui->IO).KeysData[0x206].Down == true) &&
         ((GImGui->ActiveIdUsingAllKeyboardKeys != true || (GImGui->ActiveId == 0xffffffff)))) {
        bVar29 = GImGui->KeysOwnerData[6].OwnerCurr == 0xffffffff;
      }
      else {
        bVar29 = false;
      }
      bVar30 = IsKeyPressed(ImGuiKey_Home,0xffffffff,1);
      bVar68 = IsKeyPressed(ImGuiKey_End,0xffffffff,1);
      if ((bool)(bVar30 != bVar68 | bVar67 ^ bVar29)) {
        if (pIVar27->NavLayer != ImGuiNavLayer_Main) {
          NavRestoreLayer(ImGuiNavLayer_Main);
        }
        if (((pIVar50->DC).NavLayersActiveMask != 0) || ((pIVar50->DC).NavHasScroll != true)) {
          IVar11 = pIVar27->NavLayer;
          pIVar57 = pIVar50->NavRectRel + IVar11;
          fVar70 = GImGui->FontBaseSize * pIVar50->FontWindowScale;
          if (pIVar50->ParentWindow != (ImGuiWindow *)0x0) {
            fVar70 = fVar70 * pIVar50->ParentWindow->FontWindowScale;
          }
          fVar70 = (pIVar50->NavRectRel[IVar11].Max.y - pIVar50->NavRectRel[IVar11].Min.y) +
                   (((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y) - fVar70);
          fVar70 = (float)(~-(uint)(fVar70 <= 0.0) & (uint)fVar70);
          bVar67 = IsKeyPressed(ImGuiKey_PageUp,0,1);
          if (bVar67) {
            fVar70 = -fVar70;
            IVar54 = 2;
            IVar48 = 3;
          }
          else {
            bVar67 = IsKeyPressed(ImGuiKey_PageDown,0,1);
            if (!bVar67) {
              if (!bVar30) {
                fVar70 = 0.0;
                if (bVar68) {
                  fVar93 = (pIVar50->ContentSize).y;
                  pIVar50->NavRectRel[IVar11].Max.y = fVar93;
                  pIVar50->NavRectRel[IVar11].Min.y = fVar93;
                  fVar93 = (pIVar57->Min).x;
                  pIVar3 = &pIVar50->NavRectRel[IVar11].Max;
                  if (pIVar3->x <= fVar93 && fVar93 != pIVar3->x) {
                    pIVar50->NavRectRel[IVar11].Max.x = 0.0;
                    (pIVar57->Min).x = 0.0;
                  }
                  pIVar27->NavMoveDir = 2;
                  pIVar27->NavMoveFlags = 0x50;
                }
                goto LAB_001e87d4;
              }
              pIVar50->NavRectRel[IVar11].Max.y = 0.0;
              pIVar50->NavRectRel[IVar11].Min.y = 0.0;
              fVar70 = (pIVar57->Min).x;
              pIVar3 = &pIVar50->NavRectRel[IVar11].Max;
              if (pIVar3->x <= fVar70 && fVar70 != pIVar3->x) {
                pIVar50->NavRectRel[IVar11].Max.x = 0.0;
                (pIVar57->Min).x = 0.0;
              }
              pIVar27->NavMoveDir = 3;
              pIVar27->NavMoveFlags = 0x50;
              goto LAB_001e87d1;
            }
            IVar54 = 3;
            IVar48 = 2;
          }
          pIVar27->NavMoveDir = IVar48;
          pIVar27->NavMoveClipDir = IVar54;
          pIVar27->NavMoveFlags = 0x30;
          if ((fVar70 != 0.0) || (NAN(fVar70))) {
            IVar71 = (pIVar44->InnerRect).Max;
            (pIVar45->NavScoringNoClipRect).Min = (pIVar44->InnerRect).Min;
            (pIVar45->NavScoringNoClipRect).Max = IVar71;
            (pIVar45->NavScoringNoClipRect).Min.y = (pIVar45->NavScoringNoClipRect).Min.y + fVar70;
            (pIVar45->NavScoringNoClipRect).Max.y = (pIVar45->NavScoringNoClipRect).Max.y + fVar70;
          }
          goto LAB_001e87d4;
        }
        bVar67 = IsKeyPressed(ImGuiKey_PageUp,0xffffffff,1);
        if (bVar67) {
          fVar70 = (pIVar50->Scroll).y - ((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y);
        }
        else {
          bVar67 = IsKeyPressed(ImGuiKey_PageDown,0xffffffff,1);
          if (!bVar67) {
            fVar70 = 0.0;
            if (bVar30) {
              (pIVar50->ScrollTarget).y = 0.0;
            }
            else {
              if (!bVar68) goto LAB_001e87d4;
              (pIVar50->ScrollTarget).y = (pIVar50->ScrollMax).y;
            }
            (pIVar50->ScrollTargetCenterRatio).y = 0.0;
            (pIVar50->ScrollTargetEdgeSnapDist).y = 0.0;
            goto LAB_001e87d4;
          }
          fVar70 = ((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y) + (pIVar50->Scroll).y;
        }
        (pIVar50->ScrollTarget).y = fVar70;
        (pIVar50->ScrollTargetCenterRatio).y = 0.0;
        (pIVar50->ScrollTargetEdgeSnapDist).y = 0.0;
      }
      goto LAB_001e87d1;
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar45->NavMoveFlags = 0;
    pIVar45->NavMoveScrollFlags = 0;
    if (pIVar44 != (ImGuiWindow *)0x0) {
      IVar54 = -1;
      if ((pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar44->Flags & 0x40000) == 0))
      {
        uVar69 = pIVar45->ActiveIdUsingNavDirMask;
        IVar54 = -1;
        if ((uVar69 & 1) == 0) {
          if ((bVar52 == 0) ||
             (bVar67 = IsKeyPressed(ImGuiKey_GamepadDpadLeft,0xffffffff,5), !bVar67)) {
            if ((uVar39 & 1) != 0) {
              IVar54 = -1;
              bVar67 = IsKeyPressed(ImGuiKey_LeftArrow,0xffffffff,5);
              if (bVar67) goto LAB_001e863c;
            }
          }
          else {
LAB_001e863c:
            pIVar45->NavMoveDir = 0;
            IVar54 = 0;
          }
        }
        if (((uVar69 & 2) == 0) &&
           (((bVar52 != 0 && (bVar67 = IsKeyPressed(ImGuiKey_GamepadDpadRight,0xffffffff,5), bVar67)
             ) || (((uVar39 & 1) != 0 &&
                   (bVar67 = IsKeyPressed(ImGuiKey_RightArrow,0xffffffff,5), bVar67)))))) {
          pIVar45->NavMoveDir = 1;
          IVar54 = 1;
        }
        if (((uVar69 & 4) == 0) &&
           (((bVar52 != 0 && (bVar67 = IsKeyPressed(ImGuiKey_GamepadDpadUp,0xffffffff,5), bVar67))
            || (((uVar39 & 1) != 0 && (bVar67 = IsKeyPressed(ImGuiKey_UpArrow,0xffffffff,5), bVar67)
                ))))) {
          pIVar45->NavMoveDir = 2;
          IVar54 = 2;
        }
        if (((uVar69 & 8) == 0) &&
           (((bVar52 != 0 && (bVar67 = IsKeyPressed(ImGuiKey_GamepadDpadDown,0xffffffff,5), bVar67))
            || (((uVar39 & 1) != 0 &&
                (bVar67 = IsKeyPressed(ImGuiKey_DownArrow,0xffffffff,5), bVar67)))))) {
          pIVar45->NavMoveDir = 3;
          IVar54 = 3;
        }
      }
      pIVar45->NavMoveClipDir = IVar54;
      (pIVar45->NavScoringNoClipRect).Min.x = 3.4028235e+38;
      (pIVar45->NavScoringNoClipRect).Min.y = 3.4028235e+38;
      (pIVar45->NavScoringNoClipRect).Max.x = -3.4028235e+38;
      (pIVar45->NavScoringNoClipRect).Max.y = -3.4028235e+38;
      goto LAB_001e8758;
    }
    pIVar45->NavMoveClipDir = -1;
    (pIVar45->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar45->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar45->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar45->NavScoringNoClipRect).Max.y = -3.4028235e+38;
LAB_001e87d1:
    fVar70 = 0.0;
  }
LAB_001e87d4:
  pIVar45->NavMoveForwardToNextFrame = false;
  if (pIVar45->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar45->NavMoveDir,pIVar45->NavMoveClipDir,pIVar45->NavMoveFlags,
               pIVar45->NavMoveScrollFlags);
  }
  bVar52 = pIVar45->NavMoveSubmitted;
  if (((bool)bVar52 == true) && (pIVar45->NavId == 0)) {
    if ((pIVar45->DebugLogFlags & 8) != 0) {
      if (pIVar44 == (ImGuiWindow *)0x0) {
        pcVar61 = "<NULL>";
      }
      else {
        pcVar61 = pIVar44->Name;
      }
      DebugLog("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n",pcVar61,
               (ulong)pIVar45->NavLayer);
      bVar52 = pIVar45->NavMoveSubmitted;
    }
    pIVar45->NavInitRequest = true;
    pIVar45->NavInitRequestFromMove = true;
    pIVar45->NavInitResultId = 0;
    pIVar45->NavDisableHighlight = false;
  }
  if ((((bVar52 & 1) == 0) || (pIVar45->NavInputSource != ImGuiInputSource_Gamepad)) ||
     (pIVar45->NavLayer != ImGuiNavLayer_Main || pIVar44 == (ImGuiWindow *)0x0)) {
    if (pIVar44 != (ImGuiWindow *)0x0) goto LAB_001e8a6e;
    IVar73.x = 0.0;
    IVar73.y = 0.0;
    IVar86.x = 0.0;
    IVar86.y = 0.0;
  }
  else {
    iVar96 = -(uint)((pIVar45->NavMoveFlags & 5U) == 0);
    register0x00001284 = -(uint)((pIVar45->NavMoveFlags & 10U) == 0);
    auVar87._8_4_ = 0xffffffff;
    auVar87._12_4_ = 0xffffffff;
    auVar77._4_4_ = register0x00001284;
    auVar77._0_4_ = register0x00001284;
    auVar77._8_4_ = register0x00001284;
    auVar77._12_4_ = register0x00001284;
    if (((auVar77 | auVar87) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      IVar71 = (pIVar44->DC).CursorStartPos;
      fVar93 = IVar71.x;
      auVar78._0_4_ = ((pIVar44->InnerRect).Min.x + -1.0) - fVar93;
      fVar84 = IVar71.y;
      auVar78._4_4_ = ((pIVar44->InnerRect).Min.y + -1.0) - fVar84;
      auVar78._8_4_ = ((pIVar44->InnerRect).Max.x + 1.0) - fVar93;
      auVar78._12_4_ = ((pIVar44->InnerRect).Max.y + 1.0) - fVar84;
      if (((pIVar44->NavRectRel[0].Min.x < auVar78._0_4_) ||
          (pIVar44->NavRectRel[0].Min.y < auVar78._4_4_)) ||
         ((auVar78._8_4_ < pIVar44->NavRectRel[0].Max.x ||
          (auVar78._12_4_ < pIVar44->NavRectRel[0].Max.y)))) {
        auVar88._0_8_ = CONCAT44(register0x00001284,iVar96);
        auVar88._8_4_ = iVar96;
        auVar88._12_4_ = register0x00001284;
        auVar82._0_4_ = auVar78._8_4_ - auVar78._0_4_;
        auVar82._4_4_ = auVar78._12_4_ - auVar78._4_4_;
        fVar93 = GImGui->FontBaseSize * pIVar44->FontWindowScale;
        if (pIVar44->ParentWindow != (ImGuiWindow *)0x0) {
          fVar93 = fVar93 * pIVar44->ParentWindow->FontWindowScale;
        }
        auVar91._0_4_ = fVar93 * 0.5;
        auVar91._4_4_ = auVar91._0_4_;
        auVar91._8_4_ = auVar91._0_4_;
        auVar91._12_4_ = auVar91._0_4_;
        auVar82._8_4_ = auVar82._0_4_;
        auVar82._12_4_ = auVar82._4_4_;
        auVar83 = minps(auVar82,auVar91);
        auVar23._4_8_ = auVar78._8_8_;
        auVar23._0_4_ = auVar78._4_4_ - auVar83._4_4_;
        auVar79._0_8_ = auVar23._0_8_ << 0x20;
        auVar79._8_4_ = auVar78._8_4_ - auVar83._8_4_;
        auVar79._12_4_ = auVar78._12_4_ - auVar83._12_4_;
        local_48.Min = (ImVec2)(~auVar88._0_8_ & 0xff7fffffff7fffff |
                               CONCAT44(auVar78._4_4_ + auVar83._4_4_,auVar78._0_4_ + auVar83._0_4_)
                               & auVar88._0_8_);
        local_48.Max = (ImVec2)(~auVar88._8_8_ & 0x7f7fffff7f7fffff | auVar79._8_8_ & auVar88._8_8_)
        ;
        ImRect::ClipWithFull(pIVar44->NavRectRel,&local_48);
        pIVar45->NavId = 0;
      }
    }
LAB_001e8a6e:
    IVar11 = pIVar45->NavLayer;
    fVar93 = pIVar44->NavRectRel[IVar11].Min.x;
    fVar84 = pIVar44->NavRectRel[IVar11].Max.x;
    if (fVar84 < fVar93) {
LAB_001e8aa7:
      fVar95 = 0.0;
      fVar84 = 0.0;
      fVar94 = 0.0;
      fVar93 = 0.0;
    }
    else {
      fVar94 = pIVar44->NavRectRel[IVar11].Min.y;
      fVar95 = pIVar44->NavRectRel[IVar11].Max.y;
      if (fVar95 < fVar94) goto LAB_001e8aa7;
    }
    fVar8 = (pIVar44->DC).CursorStartPos.x;
    fVar9 = (pIVar44->DC).CursorStartPos.y;
    fVar84 = fVar84 + fVar8;
    fVar93 = fVar93 + fVar8 + 1.0;
    if (fVar84 <= fVar93) {
      fVar93 = fVar84;
    }
    IVar86.y = fVar94 + fVar9 + fVar70;
    IVar86.x = fVar93;
    IVar73.y = fVar95 + fVar9 + fVar70;
    IVar73.x = fVar93;
  }
  (pIVar45->NavScoringRect).Min = IVar86;
  (pIVar45->NavScoringRect).Max = IVar73;
  if (IVar86.x < (pIVar45->NavScoringNoClipRect).Min.x) {
    (pIVar45->NavScoringNoClipRect).Min.x = IVar86.x;
  }
  if (IVar86.y < (pIVar45->NavScoringNoClipRect).Min.y) {
    (pIVar45->NavScoringNoClipRect).Min.y = IVar86.y;
  }
  pIVar3 = &(pIVar45->NavScoringNoClipRect).Max;
  fVar70 = IVar73.x;
  if (pIVar3->x <= fVar70 && fVar70 != pIVar3->x) {
    (pIVar45->NavScoringNoClipRect).Max.x = fVar70;
  }
  fVar70 = IVar73.y;
  pfVar4 = &(pIVar45->NavScoringNoClipRect).Max.y;
  if (*pfVar4 <= fVar70 && fVar70 != *pfVar4) {
    (pIVar45->NavScoringNoClipRect).Max.y = fVar70;
  }
  pIVar45 = GImGui;
  if (((pIVar66->NavMoveDir == -1) && (pIVar44 = GImGui->NavWindow, pIVar44 != (ImGuiWindow *)0x0))
     && (((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
          ((((pIVar44->Flags & 0x40000) == 0 &&
            (bVar67 = IsKeyPressed(ImGuiKey_NamedKey_BEGIN,0xffffffff,1), bVar67)) &&
           ((pIVar45->IO).KeyCtrl == false)))) && ((pIVar45->IO).KeyAlt == false)))) {
    if ((pIVar45->IO).KeyShift == false) {
      uVar39 = (uint)(pIVar45->ActiveId != 0);
      IVar54 = 3;
    }
    else {
      IVar54 = 2;
      uVar39 = 0xffffffff;
    }
    pIVar45->NavTabbingDir = uVar39;
    scroll_flags = 3;
    if (pIVar44->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,IVar54,0x400,scroll_flags);
    pIVar45->NavTabbingCounter = -1;
    pIVar45 = GImGui;
  }
  bVar67 = true;
  if (pIVar45->NavMoveScoringItems == false) {
    bVar67 = pIVar45->NavInitRequest;
  }
  pIVar45->NavAnyRequest = bVar67;
  pIVar66->NavIdIsAlive = false;
  pIVar44 = pIVar66->NavWindow;
  if (((pIVar44 != (ImGuiWindow *)0x0) && ((pIVar44->Flags & 0x40000) == 0)) &&
     (pIVar66->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar70 = pIVar45->FontBaseSize * pIVar44->FontWindowScale;
    if (pIVar44->ParentWindow != (ImGuiWindow *)0x0) {
      fVar70 = fVar70 * pIVar44->ParentWindow->FontWindowScale;
    }
    fVar70 = (float)(int)(fVar70 * 100.0 * (pIVar66->IO).DeltaTime + 0.5);
    if (((pIVar44->DC).NavLayersActiveMask == 0) &&
       (uVar39 = pIVar66->NavMoveDir, (uVar39 != 0xffffffff & (pIVar44->DC).NavHasScroll) == 1)) {
      if (uVar39 < 2) {
        (pIVar44->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0025ba98 + (ulong)(uVar39 == 0) * 4) * fVar70 +
                         (pIVar44->Scroll).x);
        (pIVar44->ScrollTargetCenterRatio).x = 0.0;
        (pIVar44->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar39 & 0xfffffffe) == 2) {
        (pIVar44->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0025ba98 + (ulong)(uVar39 == 2) * 4) * fVar70 +
                         (pIVar44->Scroll).y);
        (pIVar44->ScrollTargetCenterRatio).y = 0.0;
        (pIVar44->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    if (bVar31) {
      IVar71 = GetKeyVector2d(ImGuiKey_GamepadLStickLeft,ImGuiKey_GamepadLStickRight,
                              ImGuiKey_GamepadLStickUp,ImGuiKey_GamepadLStickDown);
      bVar67 = IsKeyDown(ImGuiKey_GamepadL1);
      if (bVar67) {
        fVar93 = 0.1;
      }
      else {
        bVar67 = IsKeyDown(ImGuiKey_GamepadR1);
        if (bVar67) {
          fVar93 = 10.0;
        }
        else {
          fVar93 = 1.0;
        }
      }
      local_b8 = IVar71.x;
      fStack_b4 = IVar71.y;
      if (((local_b8 != 0.0) || (NAN(local_b8))) && (pIVar44->ScrollbarX == true)) {
        (pIVar44->ScrollTarget).x = (float)(int)(local_b8 * fVar70 * fVar93 + (pIVar44->Scroll).x);
        (pIVar44->ScrollTargetCenterRatio).x = 0.0;
        (pIVar44->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((fStack_b4 != 0.0) || (NAN(fStack_b4))) {
        (pIVar44->ScrollTarget).y = (float)(int)(fStack_b4 * fVar70 * fVar93 + (pIVar44->Scroll).y);
        (pIVar44->ScrollTargetCenterRatio).y = 0.0;
        (pIVar44->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
  }
  if ((uVar35 & 1) == 0 && !bVar31) {
    pIVar66->NavDisableHighlight = true;
    pIVar66->NavDisableMouseHover = false;
  }
  else if (((bVar28) && (((pIVar66->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar66->IO).BackendFlags & 4) != 0)) {
    IVar71 = NavCalcPreferredRefPos();
    (pIVar66->IO).MousePosPrev = IVar71;
    (pIVar66->IO).MousePos = IVar71;
    (pIVar66->IO).WantSetMousePos = true;
    pIVar45 = GImGui;
  }
  pIVar66->NavScoringDebugCount = 0;
  IVar74 = (pIVar45->IO).MousePos;
  fVar70 = IVar74.x;
  if ((-256000.0 <= fVar70) && (fVar93 = IVar74.y, -256000.0 <= fVar93)) {
    IVar74.x = (float)(int)((int)fVar70 - (uint)((float)(int)fVar70 != fVar70 && fVar70 < 0.0));
    IVar74.y = (float)(int)((int)fVar93 - (uint)((float)(int)fVar93 != fVar93 && fVar93 < 0.0));
    pIVar45->MouseLastValidPos = IVar74;
    (pIVar45->IO).MousePos = IVar74;
  }
  fVar70 = IVar74.y;
  if ((IVar74.x < -256000.0) || (fVar70 < -256000.0)) {
LAB_001e9186:
    (pIVar45->IO).MouseDelta.x = 0.0;
    (pIVar45->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar71 = (pIVar45->IO).MousePosPrev;
    fVar93 = IVar71.x;
    if ((fVar93 < -256000.0) || (fVar84 = IVar71.y, fVar84 < -256000.0)) goto LAB_001e9186;
    IVar90.x = IVar74.x - fVar93;
    IVar90.y = fVar70 - fVar84;
    (pIVar45->IO).MouseDelta = IVar90;
    if ((((IVar90.x != 0.0) || (NAN(IVar90.x))) || (IVar90.y != 0.0)) || (NAN(IVar90.y))) {
      pIVar45->NavDisableMouseHover = false;
    }
  }
  IVar71 = (pIVar45->IO).MousePos;
  (pIVar45->IO).MousePosPrev = IVar71;
  fVar93 = IVar71.x;
  lVar56 = 0x3738;
  lVar55 = 0x3742;
  lVar49 = 0x3756;
  lVar63 = 0;
  do {
    if (*(char *)((long)pIVar45 + lVar49 + -0x2952) == '\x01') {
      fVar84 = *(float *)((long)pIVar45 + lVar56 * 4 + -0xa578);
      fVar95 = 0.0;
      *(bool *)((long)pIVar45 + lVar49 + -0x1e) = fVar84 < 0.0;
      *(undefined2 *)((long)pIVar45 + lVar56 * 2 + -0x372e) = 0;
      (&pIVar45->Initialized)[lVar49] = false;
      fVar94 = *(float *)((long)pIVar45 + lVar56 * 4 + -0xa578);
      *(float *)((long)pIVar45 + lVar56 * 4 + -0xa564) = fVar94;
      if (0.0 <= fVar94) {
        fVar95 = fVar94 + (pIVar45->IO).DeltaTime;
      }
      pbVar42 = &pIVar45->Initialized + lVar56;
      pbVar58 = &pIVar45->Initialized + lVar55;
      *(float *)((long)pIVar45 + lVar56 * 4 + -0xa578) = fVar95;
      if (0.0 <= fVar84) {
        fVar84 = 0.0;
        if (-256000.0 <= fVar93 && -256000.0 <= fVar70) {
          fVar84 = fVar93 - *(float *)((long)pIVar45 + lVar56 * 8 + -0x182d8);
          fVar94 = fVar70 - *(float *)((long)pIVar45 + lVar56 * 8 + -0x182d4);
          fVar84 = fVar84 * fVar84 + fVar94 * fVar94;
        }
        fVar94 = *(float *)((long)pIVar45 + lVar56 * 4 + -0xa550);
        uVar35 = -(uint)(fVar84 <= fVar94);
        *(uint *)((long)pIVar45 + lVar56 * 4 + -0xa550) =
             ~uVar35 & (uint)fVar84 | (uint)fVar94 & uVar35;
      }
      else {
        if ((pIVar45->IO).MouseDoubleClickTime <=
            (float)(pIVar45->Time - *(double *)((long)pIVar45 + lVar56 * 8 + -0x182b0))) {
LAB_001e9370:
          *(undefined2 *)((long)pIVar45 + lVar56 * 2 + -0x3724) = 1;
        }
        else {
          fVar84 = 0.0;
          fVar94 = 0.0;
          if (-256000.0 <= fVar93 && -256000.0 <= fVar70) {
            uVar10 = *(undefined8 *)((long)pIVar45 + lVar56 * 8 + -0x182d8);
            fVar84 = fVar93 - (float)uVar10;
            fVar94 = fVar70 - (float)((ulong)uVar10 >> 0x20);
          }
          fVar95 = (pIVar45->IO).MouseDoubleClickMaxDist;
          if (fVar95 * fVar95 <= fVar84 * fVar84 + fVar94 * fVar94) goto LAB_001e9370;
          psVar7 = (short *)((long)pIVar45 + lVar56 * 2 + -0x3724);
          *psVar7 = *psVar7 + 1;
        }
        *(double *)((long)pIVar45 + lVar56 * 8 + -0x182b0) = pIVar45->Time;
        *(ImVec2 *)((long)pIVar45 + lVar56 * 8 + -0x182d8) = IVar71;
        *(undefined2 *)((long)pIVar45 + lVar56 * 2 + -0x372e) =
             *(undefined2 *)((long)pIVar45 + lVar56 * 2 + -0x3724);
        *(undefined4 *)((long)pIVar45 + lVar56 * 4 + -0xa550) = 0;
      }
    }
    else {
      *(undefined1 *)((long)pIVar45 + lVar49 + -0x1e) = 0;
      *(undefined2 *)((long)pIVar45 + lVar56 * 2 + -0x372e) = 0;
      pbVar42 = (pIVar45->IO).MouseClicked + lVar63;
      (&pIVar45->Initialized)[lVar49] = 0.0 <= *(float *)((long)pIVar45 + lVar56 * 4 + -0xa578);
      pbVar58 = (bool *)((pIVar45->IO).MouseClickedCount + lVar63);
      *(undefined4 *)((long)pIVar45 + lVar56 * 4 + -0xa564) =
           *(undefined4 *)((long)pIVar45 + lVar56 * 4 + -0xa578);
      *(undefined4 *)((long)pIVar45 + lVar56 * 4 + -0xa578) = 0xbf800000;
    }
    *(bool *)((long)pIVar45 + lVar49 + -0x19) = *(short *)pbVar58 == 2;
    if (*pbVar42 == true) {
      pIVar45->NavDisableMouseHover = false;
    }
    lVar63 = lVar63 + 1;
    lVar56 = lVar56 + 1;
    lVar55 = lVar55 + 2;
    lVar49 = lVar49 + 1;
  } while (lVar56 != 0x373d);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar44 = GetTopMostPopupModal();
  if ((pIVar44 != (ImGuiWindow *)0x0) ||
     ((pIVar24->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar24->NavWindowingHighlightAlpha)))) {
    fVar70 = (pIVar24->IO).DeltaTime * 6.0 + pIVar24->DimBgRatio;
    if (1.0 <= fVar70) {
      fVar70 = 1.0;
    }
    pIVar24->DimBgRatio = fVar70;
  }
  else {
    fVar70 = (pIVar24->IO).DeltaTime * -10.0 + pIVar24->DimBgRatio;
    pIVar24->DimBgRatio = (float)(-(uint)(0.0 <= fVar70) & (uint)fVar70);
  }
  pIVar24->MouseCursor = 0;
  pIVar24->WantTextInputNextFrame = -1;
  pIVar24->WantCaptureMouseNextFrame = -1;
  pIVar24->WantCaptureKeyboardNextFrame = -1;
  uVar26 = *(undefined3 *)&(pIVar24->PlatformImeData).field_0x1;
  fVar70 = (pIVar24->PlatformImeData).InputPos.x;
  uVar10 = *(undefined8 *)&(pIVar24->PlatformImeData).InputPos.y;
  (pIVar24->PlatformImeDataPrev).WantVisible = (pIVar24->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar24->PlatformImeDataPrev).field_0x1 = uVar26;
  (pIVar24->PlatformImeDataPrev).InputPos.x = fVar70;
  *(undefined8 *)&(pIVar24->PlatformImeDataPrev).InputPos.y = uVar10;
  (pIVar24->PlatformImeData).WantVisible = false;
  pIVar66 = GImGui;
  pIVar45 = pIVar66;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    fVar93 = GImGui->WheelingWindowReleaseTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowReleaseTimer = fVar93;
    fVar70 = (pIVar66->IO).MousePos.x;
    if (((fVar70 < -256000.0) || (fVar84 = (pIVar66->IO).MousePos.y, fVar84 < -256000.0)) ||
       (fVar70 = fVar70 - (pIVar66->WheelingWindowRefMousePos).x,
       fVar84 = fVar84 - (pIVar66->WheelingWindowRefMousePos).y,
       fVar94 = (pIVar66->IO).MouseDragThreshold,
       fVar70 * fVar70 + fVar84 * fVar84 <= fVar94 * fVar94)) {
      if (0.0 < fVar93) goto LAB_001e9546;
    }
    else {
      pIVar66->WheelingWindowReleaseTimer = 0.0;
    }
    LockWheelingWindow((ImGuiWindow *)0x0,0.0);
    pIVar45 = GImGui;
  }
LAB_001e9546:
  fVar93 = 0.0;
  fVar70 = 0.0;
  if (pIVar45->KeysOwnerData[0x86].OwnerCurr == 0xffffffff) {
    fVar70 = (pIVar66->IO).MouseWheelH;
  }
  if (pIVar45->KeysOwnerData[0x87].OwnerCurr == 0xffffffff) {
    fVar93 = (pIVar66->IO).MouseWheel;
  }
  if (((((fVar70 != 0.0) || (fVar93 != 0.0)) || (NAN(fVar93))) &&
      ((pIVar44 = pIVar66->WheelingWindow, pIVar44 != (ImGuiWindow *)0x0 ||
       (pIVar44 = pIVar66->HoveredWindow, pIVar44 != (ImGuiWindow *)0x0)))) &&
     (pIVar44->Collapsed == false)) {
    bVar31 = (pIVar66->IO).KeyCtrl;
    fVar84 = fVar70;
    if ((fVar93 != 0.0) || (NAN(fVar93))) {
      if ((bVar31 & 1U) == 0) {
        if ((pIVar66->IO).KeyShift != false) {
          bVar31 = (pIVar66->IO).ConfigMacOSXBehaviors;
          if (bVar31 == false) {
            fVar84 = fVar93;
          }
          if (fVar93 == 0.0 || bVar31 != true) goto LAB_001ea012;
        }
        uVar35 = pIVar44->Flags;
        pIVar50 = pIVar44;
        while (((uVar35 >> 0x18 & 1) != 0 &&
               (((uVar35 & 0x210) == 0x10 ||
                ((fVar84 = (pIVar50->ScrollMax).y, fVar84 == 0.0 && (!NAN(fVar84)))))))) {
          pIVar50 = pIVar50->ParentWindow;
          uVar35 = pIVar50->Flags;
        }
        fVar84 = fVar70;
        if ((uVar35 & 0x210) == 0) {
          LockWheelingWindow(pIVar44,fVar93);
          fVar84 = ((pIVar50->InnerRect).Max.y - (pIVar50->InnerRect).Min.y) * 0.67;
          fVar94 = GImGui->FontBaseSize * pIVar50->FontWindowScale;
          if (pIVar50->ParentWindow != (ImGuiWindow *)0x0) {
            fVar94 = fVar94 * pIVar50->ParentWindow->FontWindowScale;
          }
          fVar95 = fVar94 * 5.0;
          if (fVar84 <= fVar94 * 5.0) {
            fVar95 = fVar84;
          }
          (pIVar50->ScrollTarget).y = (pIVar50->Scroll).y - fVar93 * (float)(int)fVar95;
          (pIVar50->ScrollTargetCenterRatio).y = 0.0;
          (pIVar50->ScrollTargetEdgeSnapDist).y = 0.0;
          fVar84 = fVar70;
        }
        goto LAB_001ea012;
      }
      if ((pIVar66->IO).FontAllowUserScaling == true) {
        LockWheelingWindow(pIVar44,fVar93);
        fVar70 = pIVar44->FontWindowScale;
        fVar84 = (pIVar66->IO).MouseWheel * 0.1 + fVar70;
        fVar93 = 2.5;
        if (fVar84 <= 2.5) {
          fVar93 = fVar84;
        }
        fVar93 = (float)(-(uint)(fVar84 < 0.5) & 0x3f000000 | ~-(uint)(fVar84 < 0.5) & (uint)fVar93)
        ;
        pIVar44->FontWindowScale = fVar93;
        if (pIVar44 == pIVar44->RootWindow) {
          fVar93 = fVar93 / fVar70;
          IVar71 = pIVar44->Size;
          auVar89._8_8_ = 0;
          auVar89._0_4_ = IVar71.x;
          auVar89._4_4_ = IVar71.y;
          IVar80 = (pIVar66->IO).MousePos;
          fVar70 = (pIVar44->Pos).x;
          fVar84 = (pIVar44->Pos).y;
          auVar92._0_4_ = (IVar80.x - fVar70) * (1.0 - fVar93) * IVar71.x;
          auVar92._4_4_ = (IVar80.y - fVar84) * (1.0 - fVar93) * IVar71.y;
          auVar92._8_8_ = 0;
          auVar83 = divps(auVar92,auVar89);
          local_48.Min.x = auVar83._0_4_ + fVar70;
          local_48.Min.y = auVar83._4_4_ + fVar84;
          SetWindowPos(pIVar44,&local_48.Min,0);
          IVar71 = pIVar44->SizeFull;
          IVar75.x = (float)(int)((pIVar44->Size).x * fVar93);
          IVar75.y = (float)(int)((pIVar44->Size).y * fVar93);
          pIVar44->Size = IVar75;
          (pIVar44->SizeFull).x = (float)(int)(IVar71.x * fVar93);
          (pIVar44->SizeFull).y = (float)(int)(IVar71.y * fVar93);
        }
      }
    }
    else if ((bVar31 & 1U) == 0) {
      if (((pIVar66->IO).KeyShift == true) && ((pIVar66->IO).ConfigMacOSXBehaviors == false)) {
        fVar84 = fVar93;
      }
LAB_001ea012:
      if ((fVar84 != 0.0) || (NAN(fVar84))) {
        uVar35 = pIVar44->Flags;
        pIVar50 = pIVar44;
        while (((uVar35 >> 0x18 & 1) != 0 &&
               (((uVar35 & 0x210) == 0x10 ||
                ((fVar70 = (pIVar50->ScrollMax).x, fVar70 == 0.0 && (!NAN(fVar70)))))))) {
          pIVar50 = pIVar50->ParentWindow;
          uVar35 = pIVar50->Flags;
        }
        if ((uVar35 & 0x210) == 0) {
          LockWheelingWindow(pIVar44,fVar84);
          fVar70 = ((pIVar50->InnerRect).Max.x - (pIVar50->InnerRect).Min.x) * 0.67;
          fVar93 = GImGui->FontBaseSize * pIVar50->FontWindowScale;
          if (pIVar50->ParentWindow != (ImGuiWindow *)0x0) {
            fVar93 = fVar93 * pIVar50->ParentWindow->FontWindowScale;
          }
          fVar94 = fVar93 + fVar93;
          if (fVar70 <= fVar93 + fVar93) {
            fVar94 = fVar70;
          }
          (pIVar50->ScrollTarget).x = (pIVar50->Scroll).x - fVar84 * (float)(int)fVar94;
          (pIVar50->ScrollTargetCenterRatio).x = 0.0;
          (pIVar50->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  local_a8 = 3.4028235e+38;
  if ((pIVar24->GcCompactAll == false) &&
     (fVar70 = (pIVar24->IO).ConfigMemoryCompactTimer, 0.0 <= fVar70)) {
    local_a8 = (float)pIVar24->Time - fVar70;
  }
  if ((pIVar24->Windows).Size != 0) {
    uVar40 = 0;
    do {
      pIVar44 = (pIVar24->Windows).Data[uVar40];
      bVar31 = pIVar44->Active;
      pIVar44->WasActive = bVar31;
      pIVar44->Active = false;
      pIVar44->WriteAccessed = false;
      pIVar44->BeginCountPreviousFrame = pIVar44->BeginCount;
      pIVar44->BeginCount = 0;
      if (((bVar31 == false) && (pIVar44->MemoryCompacted == false)) &&
         (pIVar44->LastTimeActive <= local_a8 && local_a8 != pIVar44->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar44);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != (uint)(pIVar24->Windows).Size);
  }
  iVar38 = (pIVar24->TablesLastTimeActive).Size;
  if (0 < iVar38) {
    lVar56 = 0;
    lVar55 = 0;
    do {
      fVar70 = (pIVar24->TablesLastTimeActive).Data[lVar55];
      if ((0.0 <= fVar70) && (fVar70 < local_a8)) {
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar24->Tables).Buf.Data)->ID + lVar56));
        iVar38 = (pIVar24->TablesLastTimeActive).Size;
      }
      lVar55 = lVar55 + 1;
      lVar56 = lVar56 + 0x218;
    } while (lVar55 < iVar38);
  }
  iVar38 = (pIVar24->TablesTempData).Size;
  if (0 < iVar38) {
    lVar56 = 0;
    lVar55 = 0;
    do {
      pIVar17 = (pIVar24->TablesTempData).Data;
      fVar70 = *(float *)((long)&pIVar17->LastTimeActive + lVar56);
      if ((0.0 <= fVar70) && (fVar70 < local_a8)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar17->TableIndex + lVar56));
        iVar38 = (pIVar24->TablesTempData).Size;
      }
      lVar55 = lVar55 + 1;
      lVar56 = lVar56 + 0x70;
    } while (lVar55 < iVar38);
  }
  if (pIVar24->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar24->GcCompactAll = false;
  if ((pIVar24->NavWindow != (ImGuiWindow *)0x0) && (pIVar24->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar24->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    __dest_01 = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar18 = (pIVar24->CurrentWindowStack).Data;
    if (pIVar18 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest_01,pIVar18,(long)(pIVar24->CurrentWindowStack).Size * 0x58);
      pIVar18 = (pIVar24->CurrentWindowStack).Data;
      if ((pIVar18 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar47 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar24->CurrentWindowStack).Data = __dest_01;
    (pIVar24->CurrentWindowStack).Capacity = 0;
  }
  (pIVar24->CurrentWindowStack).Size = 0;
  if ((pIVar24->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    __dest_02 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar19 = (pIVar24->BeginPopupStack).Data;
    if (pIVar19 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_02,pIVar19,(long)(pIVar24->BeginPopupStack).Size * 0x38);
      pIVar19 = (pIVar24->BeginPopupStack).Data;
      if ((pIVar19 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar47 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
    }
    (pIVar24->BeginPopupStack).Data = __dest_02;
    (pIVar24->BeginPopupStack).Capacity = 0;
  }
  (pIVar24->BeginPopupStack).Size = 0;
  iVar38 = (pIVar24->ItemFlagsStack).Capacity;
  if (iVar38 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    piVar46 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar47 = (pIVar24->ItemFlagsStack).Data;
    if (piVar47 != (int *)0x0) {
      memcpy(piVar46,piVar47,(long)(pIVar24->ItemFlagsStack).Size << 2);
      piVar47 = (pIVar24->ItemFlagsStack).Data;
      if ((piVar47 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar47,GImAllocatorUserData);
    }
    (pIVar24->ItemFlagsStack).Data = piVar46;
    (pIVar24->ItemFlagsStack).Size = 0;
    (pIVar24->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar24->ItemFlagsStack).Size = 0;
    if (iVar38 != 0) {
      piVar47 = (pIVar24->ItemFlagsStack).Data;
      lVar56 = 0;
      goto LAB_001e9989;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar47 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar47 = *piVar47 + 1;
  }
  piVar47 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar46 = (pIVar24->ItemFlagsStack).Data;
  if (piVar46 != (int *)0x0) {
    memcpy(piVar47,piVar46,(long)(pIVar24->ItemFlagsStack).Size << 2);
    piVar46 = (pIVar24->ItemFlagsStack).Data;
    if ((piVar46 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar5 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar5 = *piVar5 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar46,GImAllocatorUserData);
  }
  (pIVar24->ItemFlagsStack).Data = piVar47;
  (pIVar24->ItemFlagsStack).Capacity = 8;
  lVar56 = (long)(pIVar24->ItemFlagsStack).Size;
LAB_001e9989:
  piVar47[lVar56] = 0;
  (pIVar24->ItemFlagsStack).Size = (pIVar24->ItemFlagsStack).Size + 1;
  if ((pIVar24->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar47 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar47 = *piVar47 + 1;
    }
    __dest_03 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar20 = (pIVar24->GroupStack).Data;
    if (pIVar20 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_03,pIVar20,(long)(pIVar24->GroupStack).Size * 0x30);
      pIVar20 = (pIVar24->GroupStack).Data;
      if ((pIVar20 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar47 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
    }
    (pIVar24->GroupStack).Data = __dest_03;
    (pIVar24->GroupStack).Capacity = 0;
  }
  (pIVar24->GroupStack).Size = 0;
  pIVar66 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar66->DebugItemPickerActive == true) {
    IVar36 = pIVar66->HoveredIdPreviousFrame;
    pIVar66->MouseCursor = 7;
    bVar31 = IsKeyPressed(ImGuiKey_Escape,0,1);
    if (bVar31) {
      pIVar66->DebugItemPickerActive = false;
    }
    iVar38 = (pIVar66->IO).KeyMods;
    if (iVar38 != 0x3000) {
      bVar52 = pIVar66->DebugItemPickerMouseButton;
      if (((((pIVar66->IO).MouseDown[bVar52] == true) &&
           (fVar70 = (pIVar66->IO).MouseDownDuration[bVar52], fVar70 == 0.0)) && (!NAN(fVar70))) &&
         (bVar31 = TestKeyOwner(bVar52 + ImGuiKey_MouseLeft,0), IVar36 != 0 && bVar31)) {
        pIVar66->DebugItemPickerBreakId = IVar36;
        pIVar66->DebugItemPickerActive = false;
      }
    }
    lVar56 = 0;
    do {
      if (((iVar38 == 0x3000) && ((pIVar66->IO).MouseDown[lVar56] == true)) &&
         ((fVar70 = (pIVar66->IO).MouseDownDuration[lVar56], fVar70 == 0.0 &&
          ((!NAN(fVar70) && (bVar31 = TestKeyOwner((int)lVar56 + ImGuiKey_MouseLeft,0), bVar31))))))
      {
        pIVar66->DebugItemPickerMouseButton = (ImU8)lVar56;
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != 3);
    *(byte *)&(pIVar66->NextWindowData).Flags = (byte)(pIVar66->NextWindowData).Flags | 0x40;
    (pIVar66->NextWindowData).BgAlphaVal = 0.7;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X");
    Text("Press ESC to abort picking.");
    if (iVar38 == 0x3000) {
      Text("Remap w/ Ctrl+Shift: click anywhere to select new mouse button.");
    }
    else {
      TextColored((GImGui->Style).Colors + (IVar36 == 0),
                  "Click %s Button to break in debugger! (remap w/ Ctrl+Shift)",
                  &DAT_0025b9ac +
                  *(int *)(&DAT_0025b9ac + (ulong)pIVar66->DebugItemPickerMouseButton * 4));
    }
    End();
    pIVar66 = GImGui;
  }
  pIVar66->DebugHookIdInfo = 0;
  if (pIVar66->FrameCount == (pIVar66->DebugStackTool).LastActiveFrame + 1) {
    IVar36 = pIVar66->HoveredIdPreviousFrame;
    if (IVar36 == 0) {
      IVar36 = pIVar66->ActiveId;
    }
    if ((pIVar66->DebugStackTool).QueryId != IVar36) {
      (pIVar66->DebugStackTool).QueryId = IVar36;
      (pIVar66->DebugStackTool).StackLevel = -1;
      if ((pIVar66->DebugStackTool).Results.Capacity < 0) {
        piVar47 = &(pIVar66->IO).MetricsActiveAllocations;
        *piVar47 = *piVar47 + 1;
        __dest_04 = (ImGuiStackLevelInfo *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar21 = (pIVar66->DebugStackTool).Results.Data;
        if (pIVar21 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_04,pIVar21,(long)(pIVar66->DebugStackTool).Results.Size << 6);
          pIVar21 = (pIVar66->DebugStackTool).Results.Data;
          if ((pIVar21 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar47 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar47 = *piVar47 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
        }
        (pIVar66->DebugStackTool).Results.Data = __dest_04;
        (pIVar66->DebugStackTool).Results.Capacity = 0;
      }
      (pIVar66->DebugStackTool).Results.Size = 0;
    }
    if (IVar36 != 0) {
      uVar35 = (pIVar66->DebugStackTool).StackLevel;
      lVar56 = (long)(int)uVar35;
      if (lVar56 < 0) {
        if (uVar35 == 0xffffffff) {
          pIVar66->DebugHookIdInfo = IVar36;
        }
      }
      else {
        iVar38 = (pIVar66->DebugStackTool).Results.Size;
        if (((int)uVar35 < iVar38) &&
           ((pIVar21 = (pIVar66->DebugStackTool).Results.Data, pIVar21[lVar56].QuerySuccess != false
            || ('\x02' < pIVar21[lVar56].QueryFrameCount)))) {
          uVar35 = uVar35 + 1;
          (pIVar66->DebugStackTool).StackLevel = uVar35;
        }
        if ((int)uVar35 < iVar38) {
          pIVar21 = (pIVar66->DebugStackTool).Results.Data;
          pIVar66->DebugHookIdInfo = pIVar21[uVar35].ID;
          pIVar6 = &pIVar21[uVar35].QueryFrameCount;
          *pIVar6 = *pIVar6 + '\x01';
        }
      }
    }
  }
  if ((pIVar24->DebugLocateFrames != '\0') &&
     (IVar32 = pIVar24->DebugLocateFrames + 0xff, pIVar24->DebugLocateFrames = IVar32,
     IVar32 == '\0')) {
    pIVar24->DebugLocateId = 0;
  }
  pIVar24->WithinFrameScopeWithImplicitWindow = true;
  pIVar66 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar66->NextWindowData).SizeVal.x = 400.0;
  (pIVar66->NextWindowData).SizeVal.y = 400.0;
  (pIVar66->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  iVar38 = (pIVar24->Hooks).Size;
  if (0 < iVar38) {
    lVar56 = 0;
    lVar55 = 0;
    do {
      pIVar12 = (pIVar24->Hooks).Data;
      if (*(int *)(pIVar12 + lVar56 + 4) == 1) {
        (**(code **)(pIVar12 + lVar56 + 0x10))(pIVar24,pIVar12 + lVar56);
        iVar38 = (pIVar24->Hooks).Size;
      }
      lVar55 = lVar55 + 1;
      lVar56 = lVar56 + 0x20;
    } while (lVar55 < iVar38);
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Clear ActiveID if the item is not alive anymore.
    // In 1.87, the common most call to KeepAliveID() was moved from GetID() to ItemAdd().
    // As a result, custom widget using ButtonBehavior() _without_ ItemAdd() need to call KeepAliveID() themselves.
    if (g.ActiveId != 0 && g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("NewFrame(): ClearActiveID() because it isn't marked alive anymore!\n");
        ClearActiveID();
    }

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
        g.ActiveIdUsingNavInputMask = 0x00;
#endif
    }

#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    if (g.ActiveId == 0)
        g.ActiveIdUsingNavInputMask = 0;
    else if (g.ActiveIdUsingNavInputMask != 0)
    {
        // If your custom widget code used:                 { g.ActiveIdUsingNavInputMask |= (1 << ImGuiNavInput_Cancel); }
        // Since IMGUI_VERSION_NUM >= 18804 it should be:   { SetKeyOwner(ImGuiKey_Escape, g.ActiveId); SetKeyOwner(ImGuiKey_NavGamepadCancel, g.ActiveId); }
        if (g.ActiveIdUsingNavInputMask & (1 << ImGuiNavInput_Cancel))
            SetKeyOwner(ImGuiKey_Escape, g.ActiveId);
        if (g.ActiveIdUsingNavInputMask & ~(1 << ImGuiNavInput_Cancel))
            IM_ASSERT(0); // Other values unsupported
    }
#endif

    // Update hover delay for IsItemHovered() with delays and tooltips
    g.HoverDelayIdPreviousFrame = g.HoverDelayId;
    if (g.HoverDelayId != 0)
    {
        //if (g.IO.MouseDelta.x == 0.0f && g.IO.MouseDelta.y == 0.0f) // Need design/flags
        g.HoverDelayTimer += g.IO.DeltaTime;
        g.HoverDelayClearTimer = 0.0f;
        g.HoverDelayId = 0;
    }
    else if (g.HoverDelayTimer > 0.0f)
    {
        // This gives a little bit of leeway before clearing the hover timer, allowing mouse to cross gaps
        g.HoverDelayClearTimer += g.IO.DeltaTime;
        if (g.HoverDelayClearTimer >= ImMax(0.20f, g.IO.DeltaTime * 2.0f)) // ~6 frames at 30 Hz + allow for low framerate
            g.HoverDelayTimer = g.HoverDelayClearTimer = 0.0f; // May want a decaying timer, in which case need to clamp at max first, based on max of caller last requested timer.
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
        window->BeginCountPreviousFrame = window->BeginCount;
        window->BeginCount = 0;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();
    if (g.DebugLocateFrames > 0 && --g.DebugLocateFrames == 0)
        g.DebugLocateId = 0;

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it prevents ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}